

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  Geometry *pGVar75;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar82;
  undefined1 auVar91 [16];
  undefined8 in_R10;
  ulong uVar76;
  long lVar77;
  long lVar78;
  byte bVar79;
  ulong uVar80;
  float fVar81;
  float fVar133;
  float fVar135;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar88 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar89 [16];
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar90 [16];
  float fVar137;
  float fVar140;
  float fVar141;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar142;
  undefined4 uVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined8 uVar162;
  undefined1 auVar163 [32];
  float fVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar180;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  Geometry *local_618;
  RayHitK<8> *local_610;
  undefined1 (*local_608) [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  long local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  
  uVar69 = (ulong)(byte)prim[1];
  fVar164 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar165 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar166 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar172 = fVar164 * auVar166._0_4_;
  fVar142 = fVar164 * auVar165._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar83);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar19);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar6);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar91);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 * 0xc + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar101 = vpmovsxbd_avx2(auVar87);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar107 = vpmovsxbd_avx2(auVar85);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 0x13 + 6);
  auVar106 = vpmovsxbd_avx2(auVar84);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar103 = vpmovsxbd_avx2(auVar7);
  auVar102 = vcvtdq2ps_avx(auVar103);
  auVar208._4_4_ = fVar142;
  auVar208._0_4_ = fVar142;
  auVar208._8_4_ = fVar142;
  auVar208._12_4_ = fVar142;
  auVar208._16_4_ = fVar142;
  auVar208._20_4_ = fVar142;
  auVar208._24_4_ = fVar142;
  auVar208._28_4_ = fVar142;
  auVar210._8_4_ = 1;
  auVar210._0_8_ = 0x100000001;
  auVar210._12_4_ = 1;
  auVar210._16_4_ = 1;
  auVar210._20_4_ = 1;
  auVar210._24_4_ = 1;
  auVar210._28_4_ = 1;
  auVar95 = ZEXT1632(CONCAT412(fVar164 * auVar165._12_4_,
                               CONCAT48(fVar164 * auVar165._8_4_,
                                        CONCAT44(fVar164 * auVar165._4_4_,fVar142))));
  auVar94 = vpermps_avx2(auVar210,auVar95);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar93 = vpermps_avx512vl(auVar92,auVar95);
  fVar142 = auVar93._0_4_;
  auVar214._0_4_ = fVar142 * auVar97._0_4_;
  fVar156 = auVar93._4_4_;
  auVar214._4_4_ = fVar156 * auVar97._4_4_;
  fVar157 = auVar93._8_4_;
  auVar214._8_4_ = fVar157 * auVar97._8_4_;
  fVar158 = auVar93._12_4_;
  auVar214._12_4_ = fVar158 * auVar97._12_4_;
  fVar159 = auVar93._16_4_;
  auVar214._16_4_ = fVar159 * auVar97._16_4_;
  fVar160 = auVar93._20_4_;
  auVar214._20_4_ = fVar160 * auVar97._20_4_;
  fVar161 = auVar93._24_4_;
  auVar214._28_36_ = in_ZMM4._28_36_;
  auVar214._24_4_ = fVar161 * auVar97._24_4_;
  auVar95._4_4_ = auVar101._4_4_ * fVar156;
  auVar95._0_4_ = auVar101._0_4_ * fVar142;
  auVar95._8_4_ = auVar101._8_4_ * fVar157;
  auVar95._12_4_ = auVar101._12_4_ * fVar158;
  auVar95._16_4_ = auVar101._16_4_ * fVar159;
  auVar95._20_4_ = auVar101._20_4_ * fVar160;
  auVar95._24_4_ = auVar101._24_4_ * fVar161;
  auVar95._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar102._4_4_ * fVar156;
  auVar103._0_4_ = auVar102._0_4_ * fVar142;
  auVar103._8_4_ = auVar102._8_4_ * fVar157;
  auVar103._12_4_ = auVar102._12_4_ * fVar158;
  auVar103._16_4_ = auVar102._16_4_ * fVar159;
  auVar103._20_4_ = auVar102._20_4_ * fVar160;
  auVar103._24_4_ = auVar102._24_4_ * fVar161;
  auVar103._28_4_ = auVar93._28_4_;
  auVar83 = vfmadd231ps_fma(auVar214._0_32_,auVar94,auVar96);
  auVar19 = vfmadd231ps_fma(auVar95,auVar94,auVar99);
  auVar6 = vfmadd231ps_fma(auVar103,auVar106,auVar94);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar208,auVar100);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar208,auVar98);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar107,auVar208);
  auVar209._4_4_ = fVar172;
  auVar209._0_4_ = fVar172;
  auVar209._8_4_ = fVar172;
  auVar209._12_4_ = fVar172;
  auVar209._16_4_ = fVar172;
  auVar209._20_4_ = fVar172;
  auVar209._24_4_ = fVar172;
  auVar209._28_4_ = fVar172;
  auVar94 = ZEXT1632(CONCAT412(fVar164 * auVar166._12_4_,
                               CONCAT48(fVar164 * auVar166._8_4_,
                                        CONCAT44(fVar164 * auVar166._4_4_,fVar172))));
  auVar103 = vpermps_avx2(auVar210,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  auVar95 = vmulps_avx512vl(auVar94,auVar97);
  auVar105._0_4_ = auVar94._0_4_ * auVar101._0_4_;
  auVar105._4_4_ = auVar94._4_4_ * auVar101._4_4_;
  auVar105._8_4_ = auVar94._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar94._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * auVar101._16_4_;
  auVar105._20_4_ = auVar94._20_4_ * auVar101._20_4_;
  auVar105._24_4_ = auVar94._24_4_ * auVar101._24_4_;
  auVar105._28_4_ = 0;
  auVar101._4_4_ = auVar94._4_4_ * auVar102._4_4_;
  auVar101._0_4_ = auVar94._0_4_ * auVar102._0_4_;
  auVar101._8_4_ = auVar94._8_4_ * auVar102._8_4_;
  auVar101._12_4_ = auVar94._12_4_ * auVar102._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * auVar102._16_4_;
  auVar101._20_4_ = auVar94._20_4_ * auVar102._20_4_;
  auVar101._24_4_ = auVar94._24_4_ * auVar102._24_4_;
  auVar101._28_4_ = auVar97._28_4_;
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar96);
  auVar91 = vfmadd231ps_fma(auVar105,auVar103,auVar99);
  auVar86 = vfmadd231ps_fma(auVar101,auVar103,auVar106);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar209,auVar100);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar209,auVar98);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar209,auVar107);
  auVar199._8_4_ = 0x7fffffff;
  auVar199._0_8_ = 0x7fffffff7fffffff;
  auVar199._12_4_ = 0x7fffffff;
  auVar199._16_4_ = 0x7fffffff;
  auVar199._20_4_ = 0x7fffffff;
  auVar199._24_4_ = 0x7fffffff;
  auVar199._28_4_ = 0x7fffffff;
  auVar100 = vandps_avx(ZEXT1632(auVar83),auVar199);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar198._16_4_ = 0x219392ef;
  auVar198._20_4_ = 0x219392ef;
  auVar198._24_4_ = 0x219392ef;
  auVar198._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar100,auVar198,1);
  bVar12 = (bool)((byte)uVar76 & 1);
  auVar94._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._0_4_;
  bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._4_4_;
  bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._8_4_;
  bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar19),auVar199);
  uVar76 = vcmpps_avx512vl(auVar100,auVar198,1);
  bVar12 = (bool)((byte)uVar76 & 1);
  auVar92._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._0_4_;
  bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._4_4_;
  bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._8_4_;
  bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar6),auVar199);
  uVar76 = vcmpps_avx512vl(auVar100,auVar198,1);
  bVar12 = (bool)((byte)uVar76 & 1);
  auVar100._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._0_4_;
  bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._4_4_;
  bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._8_4_;
  bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar214 = ZEXT3264(auVar98);
  auVar99 = vfnmadd213ps_avx512vl(auVar94,auVar97,auVar98);
  auVar83 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar92);
  auVar99 = vfnmadd213ps_avx512vl(auVar92,auVar97,auVar98);
  auVar19 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar100);
  auVar100 = vfnmadd213ps_avx512vl(auVar100,auVar97,auVar98);
  auVar6 = vfmadd132ps_fma(auVar100,auVar97,auVar97);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx512vl(auVar100,auVar96);
  auVar107._4_4_ = auVar83._4_4_ * auVar100._4_4_;
  auVar107._0_4_ = auVar83._0_4_ * auVar100._0_4_;
  auVar107._8_4_ = auVar83._8_4_ * auVar100._8_4_;
  auVar107._12_4_ = auVar83._12_4_ * auVar100._12_4_;
  auVar107._16_4_ = auVar100._16_4_ * 0.0;
  auVar107._20_4_ = auVar100._20_4_ * 0.0;
  auVar107._24_4_ = auVar100._24_4_ * 0.0;
  auVar107._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx512vl(auVar100,auVar96);
  auVar181._0_4_ = auVar83._0_4_ * auVar100._0_4_;
  auVar181._4_4_ = auVar83._4_4_ * auVar100._4_4_;
  auVar181._8_4_ = auVar83._8_4_ * auVar100._8_4_;
  auVar181._12_4_ = auVar83._12_4_ * auVar100._12_4_;
  auVar181._16_4_ = auVar100._16_4_ * 0.0;
  auVar181._20_4_ = auVar100._20_4_ * 0.0;
  auVar181._24_4_ = auVar100._24_4_ * 0.0;
  auVar181._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0xe + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar91));
  auVar101 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar106._4_4_ = auVar19._4_4_ * auVar100._4_4_;
  auVar106._0_4_ = auVar19._0_4_ * auVar100._0_4_;
  auVar106._8_4_ = auVar19._8_4_ * auVar100._8_4_;
  auVar106._12_4_ = auVar19._12_4_ * auVar100._12_4_;
  auVar106._16_4_ = auVar100._16_4_ * 0.0;
  auVar106._20_4_ = auVar100._20_4_ * 0.0;
  auVar106._24_4_ = auVar100._24_4_ * 0.0;
  auVar106._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar96);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar91));
  auVar104._0_4_ = auVar19._0_4_ * auVar100._0_4_;
  auVar104._4_4_ = auVar19._4_4_ * auVar100._4_4_;
  auVar104._8_4_ = auVar19._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar19._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x15 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar86));
  auVar102._4_4_ = auVar100._4_4_ * auVar6._4_4_;
  auVar102._0_4_ = auVar100._0_4_ * auVar6._0_4_;
  auVar102._8_4_ = auVar100._8_4_ * auVar6._8_4_;
  auVar102._12_4_ = auVar100._12_4_ * auVar6._12_4_;
  auVar102._16_4_ = auVar100._16_4_ * 0.0;
  auVar102._20_4_ = auVar100._20_4_ * 0.0;
  auVar102._24_4_ = auVar100._24_4_ * 0.0;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar86));
  auVar93._0_4_ = auVar6._0_4_ * auVar100._0_4_;
  auVar93._4_4_ = auVar6._4_4_ * auVar100._4_4_;
  auVar93._8_4_ = auVar6._8_4_ * auVar100._8_4_;
  auVar93._12_4_ = auVar6._12_4_ * auVar100._12_4_;
  auVar93._16_4_ = auVar100._16_4_ * 0.0;
  auVar93._20_4_ = auVar100._20_4_ * 0.0;
  auVar93._24_4_ = auVar100._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar107,auVar181);
  auVar96 = vpminsd_avx2(auVar106,auVar104);
  auVar100 = vmaxps_avx(auVar100,auVar96);
  auVar96 = vpminsd_avx2(auVar102,auVar93);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar97._4_4_ = uVar3;
  auVar97._0_4_ = uVar3;
  auVar97._8_4_ = uVar3;
  auVar97._12_4_ = uVar3;
  auVar97._16_4_ = uVar3;
  auVar97._20_4_ = uVar3;
  auVar97._24_4_ = uVar3;
  auVar97._28_4_ = uVar3;
  auVar96 = vmaxps_avx512vl(auVar96,auVar97);
  auVar100 = vmaxps_avx(auVar100,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_520 = vmulps_avx512vl(auVar100,auVar96);
  auVar215 = ZEXT3264(local_520);
  auVar100 = vpmaxsd_avx2(auVar107,auVar181);
  auVar96 = vpmaxsd_avx2(auVar106,auVar104);
  auVar100 = vminps_avx(auVar100,auVar96);
  auVar96 = vpmaxsd_avx2(auVar102,auVar93);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar98._4_4_ = uVar3;
  auVar98._0_4_ = uVar3;
  auVar98._8_4_ = uVar3;
  auVar98._12_4_ = uVar3;
  auVar98._16_4_ = uVar3;
  auVar98._20_4_ = uVar3;
  auVar98._24_4_ = uVar3;
  auVar98._28_4_ = uVar3;
  auVar96 = vminps_avx512vl(auVar96,auVar98);
  auVar100 = vminps_avx(auVar100,auVar96);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar99);
  uVar162 = vcmpps_avx512vl(local_520,auVar100,2);
  uVar20 = vpcmpgtd_avx512vl(auVar101,_DAT_01fb4ba0);
  uVar76 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar162 & (byte)uVar20));
  local_608 = (undefined1 (*) [32])&local_140;
  local_2e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar216 = ZEXT1664(auVar83);
  local_610 = ray;
  do {
    if (uVar76 == 0) {
      return;
    }
    lVar74 = 0;
    for (uVar70 = uVar76; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      lVar74 = lVar74 + 1;
    }
    uVar76 = uVar76 - 1 & uVar76;
    uVar3 = *(undefined4 *)(prim + lVar74 * 4 + 6);
    uVar70 = (ulong)(uint)((int)lVar74 << 6);
    uVar8 = *(uint *)(prim + 2);
    pGVar75 = (context->scene->geometries).items[uVar8].ptr;
    local_600._0_8_ = pGVar75;
    auVar83 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x16);
    if (uVar76 != 0) {
      uVar73 = uVar76 - 1 & uVar76;
      for (uVar80 = uVar76; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
      if (uVar73 != 0) {
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar19 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x26);
    auVar6 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x36);
    auVar91 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x46);
    iVar9 = (int)pGVar75[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar85 = vsubps_avx(auVar83,auVar86);
    uVar143 = auVar85._0_4_;
    auVar165._4_4_ = uVar143;
    auVar165._0_4_ = uVar143;
    auVar165._8_4_ = uVar143;
    auVar165._12_4_ = uVar143;
    auVar87 = vshufps_avx(auVar85,auVar85,0x55);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    fVar164 = pre->ray_space[k].vz.field_0.m128[0];
    fVar142 = pre->ray_space[k].vz.field_0.m128[1];
    fVar156 = pre->ray_space[k].vz.field_0.m128[2];
    fVar157 = pre->ray_space[k].vz.field_0.m128[3];
    auVar88._0_4_ = fVar164 * auVar85._0_4_;
    auVar88._4_4_ = fVar142 * auVar85._4_4_;
    auVar88._8_4_ = fVar156 * auVar85._8_4_;
    auVar88._12_4_ = fVar157 * auVar85._12_4_;
    auVar87 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar87);
    auVar7 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar165);
    auVar87 = vshufps_avx(auVar83,auVar83,0xff);
    auVar84 = vsubps_avx(auVar19,auVar86);
    uVar143 = auVar84._0_4_;
    auVar173._4_4_ = uVar143;
    auVar173._0_4_ = uVar143;
    auVar173._8_4_ = uVar143;
    auVar173._12_4_ = uVar143;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar202._0_4_ = fVar164 * auVar84._0_4_;
    auVar202._4_4_ = fVar142 * auVar84._4_4_;
    auVar202._8_4_ = fVar156 * auVar84._8_4_;
    auVar202._12_4_ = fVar157 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar85);
    auVar165 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar173);
    auVar84 = vsubps_avx512vl(auVar6,auVar86);
    uVar143 = auVar84._0_4_;
    auVar174._4_4_ = uVar143;
    auVar174._0_4_ = uVar143;
    auVar174._8_4_ = uVar143;
    auVar174._12_4_ = uVar143;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar89._0_4_ = fVar164 * auVar84._0_4_;
    auVar89._4_4_ = fVar142 * auVar84._4_4_;
    auVar89._8_4_ = fVar156 * auVar84._8_4_;
    auVar89._12_4_ = fVar157 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar85);
    auVar84 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar174);
    auVar85 = vsubps_avx512vl(auVar91,auVar86);
    uVar143 = auVar85._0_4_;
    auVar166._4_4_ = uVar143;
    auVar166._0_4_ = uVar143;
    auVar166._8_4_ = uVar143;
    auVar166._12_4_ = uVar143;
    auVar86 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar90._0_4_ = fVar164 * auVar85._0_4_;
    auVar90._4_4_ = fVar142 * auVar85._4_4_;
    auVar90._8_4_ = fVar156 * auVar85._8_4_;
    auVar90._12_4_ = fVar157 * auVar85._12_4_;
    auVar86 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar5,auVar86);
    auVar85 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar166);
    lVar74 = (long)iVar9;
    lVar78 = lVar74 * 0x44;
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar78);
    uVar143 = auVar7._0_4_;
    local_420._4_4_ = uVar143;
    local_420._0_4_ = uVar143;
    local_420._8_4_ = uVar143;
    local_420._12_4_ = uVar143;
    local_420._16_4_ = uVar143;
    local_420._20_4_ = uVar143;
    local_420._24_4_ = uVar143;
    local_420._28_4_ = uVar143;
    auVar148._8_4_ = 1;
    auVar148._0_8_ = 0x100000001;
    auVar148._12_4_ = 1;
    auVar148._16_4_ = 1;
    auVar148._20_4_ = 1;
    auVar148._24_4_ = 1;
    auVar148._28_4_ = 1;
    local_440 = vpermps_avx2(auVar148,ZEXT1632(auVar7));
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x484);
    local_460 = vbroadcastss_avx512vl(auVar165);
    local_480 = vpermps_avx512vl(auVar148,ZEXT1632(auVar165));
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x908);
    local_4a0 = vbroadcastss_avx512vl(auVar84);
    local_4c0 = vpermps_avx512vl(auVar148,ZEXT1632(auVar84));
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0xd8c);
    fVar159 = auVar85._0_4_;
    local_4e0._4_4_ = fVar159;
    local_4e0._0_4_ = fVar159;
    fStack_4d8 = fVar159;
    fStack_4d4 = fVar159;
    fStack_4d0 = fVar159;
    fStack_4cc = fVar159;
    fStack_4c8 = fVar159;
    register0x0000139c = fVar159;
    _local_500 = vpermps_avx512vl(auVar148,ZEXT1632(auVar85));
    auVar99 = vmulps_avx512vl(_local_4e0,auVar98);
    auVar101 = vmulps_avx512vl(_local_500,auVar98);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_4a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_4c0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_460);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,local_480);
    auVar102 = vfmadd231ps_avx512vl(auVar99,auVar100,local_420);
    auVar197 = ZEXT3264(auVar102);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar100,local_440);
    auVar188 = ZEXT3264(auVar103);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar78);
    auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x484);
    auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x908);
    auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0xd8c);
    auVar94 = vmulps_avx512vl(_local_4e0,auVar106);
    auVar95 = vmulps_avx512vl(_local_500,auVar106);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_4a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,local_4c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_460);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_480);
    auVar166 = vfmadd231ps_fma(auVar94,auVar99,local_420);
    auVar200 = ZEXT1664(auVar166);
    auVar173 = vfmadd231ps_fma(auVar95,auVar99,local_440);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar166),auVar102);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar173),auVar103);
    auVar92 = vmulps_avx512vl(auVar103,auVar94);
    auVar93 = vmulps_avx512vl(auVar102,auVar95);
    auVar92 = vsubps_avx512vl(auVar92,auVar93);
    auVar86 = vshufps_avx(auVar19,auVar19,0xff);
    uVar162 = auVar87._0_8_;
    local_80._8_8_ = uVar162;
    local_80._0_8_ = uVar162;
    local_80._16_8_ = uVar162;
    local_80._24_8_ = uVar162;
    local_a0 = vbroadcastsd_avx512vl(auVar86);
    auVar86 = vshufps_avx512vl(auVar6,auVar6,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar86);
    auVar86 = vshufps_avx512vl(auVar91,auVar91,0xff);
    uVar162 = auVar86._0_8_;
    local_e0._8_8_ = uVar162;
    local_e0._0_8_ = uVar162;
    local_e0._16_8_ = uVar162;
    local_e0._24_8_ = uVar162;
    auVar93 = vmulps_avx512vl(local_e0,auVar98);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,local_c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_a0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_80);
    auVar104 = vmulps_avx512vl(local_e0,auVar106);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_c0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_a0);
    auVar174 = vfmadd231ps_fma(auVar104,auVar99,local_80);
    auVar104 = vmulps_avx512vl(auVar95,auVar95);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,auVar94);
    auVar105 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar174));
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vmulps_avx512vl(auVar105,auVar104);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    uVar162 = vcmpps_avx512vl(auVar92,auVar104,2);
    auVar86 = vblendps_avx(auVar7,auVar83,8);
    auVar202 = auVar216._0_16_;
    auVar87 = vandps_avx512vl(auVar86,auVar202);
    auVar86 = vblendps_avx(auVar165,auVar19,8);
    auVar86 = vandps_avx512vl(auVar86,auVar202);
    auVar87 = vmaxps_avx(auVar87,auVar86);
    auVar86 = vblendps_avx(auVar84,auVar6,8);
    auVar88 = vandps_avx512vl(auVar86,auVar202);
    auVar86 = vblendps_avx(auVar85,auVar91,8);
    auVar86 = vandps_avx512vl(auVar86,auVar202);
    auVar86 = vmaxps_avx(auVar88,auVar86);
    auVar86 = vmaxps_avx(auVar87,auVar86);
    auVar87 = vmovshdup_avx(auVar86);
    auVar87 = vmaxss_avx(auVar87,auVar86);
    auVar86 = vshufpd_avx(auVar86,auVar86,1);
    auVar86 = vmaxss_avx(auVar86,auVar87);
    auVar87 = vcvtsi2ss_avx512f(auVar91,iVar9);
    local_580._0_16_ = auVar87;
    auVar205._0_4_ = auVar87._0_4_;
    auVar205._4_4_ = auVar205._0_4_;
    auVar205._8_4_ = auVar205._0_4_;
    auVar205._12_4_ = auVar205._0_4_;
    auVar205._16_4_ = auVar205._0_4_;
    auVar205._20_4_ = auVar205._0_4_;
    auVar205._24_4_ = auVar205._0_4_;
    auVar205._28_4_ = auVar205._0_4_;
    uVar20 = vcmpps_avx512vl(auVar205,_DAT_01f7b060,0xe);
    bVar79 = (byte)uVar162 & (byte)uVar20;
    fVar164 = auVar86._0_4_ * 4.7683716e-07;
    local_630 = ZEXT416((uint)fVar164);
    auVar206._8_4_ = 2;
    auVar206._0_8_ = 0x200000002;
    auVar206._12_4_ = 2;
    auVar206._16_4_ = 2;
    auVar206._20_4_ = 2;
    auVar206._24_4_ = 2;
    auVar206._28_4_ = 2;
    auVar92 = vpermps_avx512vl(auVar206,ZEXT1632(auVar7));
    local_240 = vpermps_avx2(auVar206,ZEXT1632(auVar165));
    local_260 = vpermps_avx2(auVar206,ZEXT1632(auVar84));
    local_280 = vpermps_avx2(auVar206,ZEXT1632(auVar85));
    uVar71 = *(uint *)(ray + k * 4 + 0x60);
    local_640 = ZEXT416(uVar71);
    local_2a0 = vpbroadcastd_avx512vl();
    local_2c0 = vpbroadcastd_avx512vl();
    local_680 = auVar19._0_8_;
    uStack_678 = auVar19._8_8_;
    local_690 = auVar6._0_8_;
    uStack_688 = auVar6._8_8_;
    local_6a0._0_4_ = auVar91._0_4_;
    fVar142 = (float)local_6a0;
    local_6a0._4_4_ = auVar91._4_4_;
    fVar156 = local_6a0._4_4_;
    uStack_698._0_4_ = auVar91._8_4_;
    fVar157 = (float)uStack_698;
    uStack_698._4_4_ = auVar91._12_4_;
    fVar158 = uStack_698._4_4_;
    local_6a0 = auVar91._0_8_;
    uStack_698 = auVar91._8_8_;
    if (bVar79 != 0) {
      auVar106 = vmulps_avx512vl(local_280,auVar106);
      auVar107 = vfmadd213ps_avx512vl(auVar107,local_260,auVar106);
      auVar101 = vfmadd213ps_avx512vl(auVar101,local_240,auVar107);
      auVar101 = vfmadd213ps_avx512vl(auVar99,auVar92,auVar101);
      auVar98 = vmulps_avx512vl(local_280,auVar98);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_260,auVar98);
      auVar107 = vfmadd213ps_avx512vl(auVar96,local_240,auVar97);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1210);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1694);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1b18);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1f9c);
      auVar107 = vfmadd213ps_avx512vl(auVar100,auVar92,auVar107);
      auVar203._0_4_ = fVar159 * auVar99._0_4_;
      auVar203._4_4_ = fVar159 * auVar99._4_4_;
      auVar203._8_4_ = fVar159 * auVar99._8_4_;
      auVar203._12_4_ = fVar159 * auVar99._12_4_;
      auVar203._16_4_ = fVar159 * auVar99._16_4_;
      auVar203._20_4_ = fVar159 * auVar99._20_4_;
      auVar203._24_4_ = fVar159 * auVar99._24_4_;
      auVar203._28_4_ = 0;
      auVar100 = vmulps_avx512vl(_local_500,auVar99);
      auVar99 = vmulps_avx512vl(local_280,auVar99);
      auVar106 = vfmadd231ps_avx512vl(auVar203,auVar98,local_4a0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_4c0);
      auVar98 = vfmadd231ps_avx512vl(auVar99,local_260,auVar98);
      auVar99 = vfmadd231ps_avx512vl(auVar106,auVar97,local_460);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_480);
      auVar106 = vfmadd231ps_avx512vl(auVar98,local_240,auVar97);
      auVar91 = vfmadd231ps_fma(auVar99,auVar96,local_420);
      auVar99 = vfmadd231ps_avx512vl(auVar100,auVar96,local_440);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1210);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1f9c);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar96);
      auVar28._4_4_ = fVar159 * auVar98._4_4_;
      auVar28._0_4_ = fVar159 * auVar98._0_4_;
      auVar28._8_4_ = fVar159 * auVar98._8_4_;
      auVar28._12_4_ = fVar159 * auVar98._12_4_;
      auVar28._16_4_ = fVar159 * auVar98._16_4_;
      auVar28._20_4_ = fVar159 * auVar98._20_4_;
      auVar28._24_4_ = fVar159 * auVar98._24_4_;
      auVar28._28_4_ = auVar96._28_4_;
      auVar96 = vmulps_avx512vl(_local_500,auVar98);
      auVar98 = vmulps_avx512vl(local_280,auVar98);
      auVar216 = ZEXT1664(auVar202);
      auVar104 = vfmadd231ps_avx512vl(auVar28,auVar97,local_4a0);
      auVar105 = vfmadd231ps_avx512vl(auVar96,auVar97,local_4c0);
      auVar213 = ZEXT3264(auVar92);
      auVar97 = vfmadd231ps_avx512vl(auVar98,local_260,auVar97);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1694);
      auVar98 = vfmadd231ps_avx512vl(auVar104,auVar96,local_460);
      auVar104 = vfmadd231ps_avx512vl(auVar105,auVar96,local_480);
      auVar96 = vfmadd231ps_avx512vl(auVar97,local_240,auVar96);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar214 = ZEXT3264(auVar105);
      auVar86 = vfmadd231ps_fma(auVar98,auVar100,local_420);
      auVar97 = vfmadd231ps_avx512vl(auVar104,auVar100,local_440);
      auVar98 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar100);
      auVar211._8_4_ = 0x7fffffff;
      auVar211._0_8_ = 0x7fffffff7fffffff;
      auVar211._12_4_ = 0x7fffffff;
      auVar211._16_4_ = 0x7fffffff;
      auVar211._20_4_ = 0x7fffffff;
      auVar211._24_4_ = 0x7fffffff;
      auVar211._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(ZEXT1632(auVar91),auVar211);
      auVar96 = vandps_avx(auVar99,auVar211);
      auVar96 = vmaxps_avx(auVar100,auVar96);
      auVar100 = vandps_avx(auVar106,auVar211);
      auVar100 = vmaxps_avx(auVar96,auVar100);
      auVar207._4_4_ = fVar164;
      auVar207._0_4_ = fVar164;
      auVar207._8_4_ = fVar164;
      auVar207._12_4_ = fVar164;
      auVar207._16_4_ = fVar164;
      auVar207._20_4_ = fVar164;
      auVar207._24_4_ = fVar164;
      auVar207._28_4_ = fVar164;
      uVar70 = vcmpps_avx512vl(auVar100,auVar207,1);
      bVar12 = (bool)((byte)uVar70 & 1);
      auVar108._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar91._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar91._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar91._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar91._12_4_);
      fVar164 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar94._16_4_);
      auVar108._16_4_ = fVar164;
      fVar160 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar94._20_4_);
      auVar108._20_4_ = fVar160;
      fVar159 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar94._24_4_);
      auVar108._24_4_ = fVar159;
      uVar72 = (uint)(byte)(uVar70 >> 7) * auVar94._28_4_;
      auVar108._28_4_ = uVar72;
      bVar12 = (bool)((byte)uVar70 & 1);
      auVar109._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar99._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar99._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar99._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar99._12_4_);
      bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar109._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar99._16_4_);
      bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar109._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar99._20_4_);
      bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar109._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar99._24_4_);
      bVar12 = SUB81(uVar70 >> 7,0);
      auVar109._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar99._28_4_;
      auVar100 = vandps_avx(auVar211,ZEXT1632(auVar86));
      auVar96 = vandps_avx(auVar97,auVar211);
      auVar96 = vmaxps_avx(auVar100,auVar96);
      auVar100 = vandps_avx(auVar98,auVar211);
      auVar100 = vmaxps_avx(auVar96,auVar100);
      uVar70 = vcmpps_avx512vl(auVar100,auVar207,1);
      bVar12 = (bool)((byte)uVar70 & 1);
      auVar110._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar86._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar86._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar86._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar86._12_4_);
      fVar180 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar94._16_4_);
      auVar110._16_4_ = fVar180;
      fVar172 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar94._20_4_);
      auVar110._20_4_ = fVar172;
      fVar161 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar94._24_4_);
      auVar110._24_4_ = fVar161;
      auVar110._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar94._28_4_;
      bVar12 = (bool)((byte)uVar70 & 1);
      auVar111._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar97._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar97._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar97._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar97._12_4_);
      bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar97._16_4_);
      bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar97._20_4_);
      bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar97._24_4_);
      bVar12 = SUB81(uVar70 >> 7,0);
      auVar111._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar97._28_4_;
      auVar89 = vxorps_avx512vl(local_460._0_16_,local_460._0_16_);
      auVar100 = vfmadd213ps_avx512vl(auVar108,auVar108,ZEXT1632(auVar89));
      auVar91 = vfmadd231ps_fma(auVar100,auVar109,auVar109);
      auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
      fVar81 = auVar100._0_4_;
      fVar82 = auVar100._4_4_;
      fVar133 = auVar100._8_4_;
      fVar134 = auVar100._12_4_;
      fVar135 = auVar100._16_4_;
      fVar136 = auVar100._20_4_;
      fVar138 = auVar100._24_4_;
      auVar29._4_4_ = fVar82 * fVar82 * fVar82 * auVar91._4_4_ * -0.5;
      auVar29._0_4_ = fVar81 * fVar81 * fVar81 * auVar91._0_4_ * -0.5;
      auVar29._8_4_ = fVar133 * fVar133 * fVar133 * auVar91._8_4_ * -0.5;
      auVar29._12_4_ = fVar134 * fVar134 * fVar134 * auVar91._12_4_ * -0.5;
      auVar29._16_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar29._20_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar29._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar29._28_4_ = 0;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar97 = vfmadd231ps_avx512vl(auVar29,auVar96,auVar100);
      auVar30._4_4_ = auVar109._4_4_ * auVar97._4_4_;
      auVar30._0_4_ = auVar109._0_4_ * auVar97._0_4_;
      auVar30._8_4_ = auVar109._8_4_ * auVar97._8_4_;
      auVar30._12_4_ = auVar109._12_4_ * auVar97._12_4_;
      auVar30._16_4_ = auVar109._16_4_ * auVar97._16_4_;
      auVar30._20_4_ = auVar109._20_4_ * auVar97._20_4_;
      auVar30._24_4_ = auVar109._24_4_ * auVar97._24_4_;
      auVar30._28_4_ = auVar100._28_4_;
      auVar31._4_4_ = auVar97._4_4_ * -auVar108._4_4_;
      auVar31._0_4_ = auVar97._0_4_ * -auVar108._0_4_;
      auVar31._8_4_ = auVar97._8_4_ * -auVar108._8_4_;
      auVar31._12_4_ = auVar97._12_4_ * -auVar108._12_4_;
      auVar31._16_4_ = auVar97._16_4_ * -fVar164;
      auVar31._20_4_ = auVar97._20_4_ * -fVar160;
      auVar31._24_4_ = auVar97._24_4_ * -fVar159;
      auVar31._28_4_ = uVar72 ^ 0x80000000;
      auVar100 = vmulps_avx512vl(auVar97,ZEXT1632(auVar89));
      auVar94 = ZEXT1632(auVar89);
      auVar98 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar94);
      auVar91 = vfmadd231ps_fma(auVar98,auVar111,auVar111);
      auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
      fVar164 = auVar98._0_4_;
      fVar159 = auVar98._4_4_;
      fVar160 = auVar98._8_4_;
      fVar81 = auVar98._12_4_;
      fVar82 = auVar98._16_4_;
      fVar133 = auVar98._20_4_;
      fVar134 = auVar98._24_4_;
      auVar32._4_4_ = fVar159 * fVar159 * fVar159 * auVar91._4_4_ * -0.5;
      auVar32._0_4_ = fVar164 * fVar164 * fVar164 * auVar91._0_4_ * -0.5;
      auVar32._8_4_ = fVar160 * fVar160 * fVar160 * auVar91._8_4_ * -0.5;
      auVar32._12_4_ = fVar81 * fVar81 * fVar81 * auVar91._12_4_ * -0.5;
      auVar32._16_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar32._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar32._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar32._28_4_ = 0;
      auVar96 = vfmadd231ps_avx512vl(auVar32,auVar96,auVar98);
      auVar33._4_4_ = auVar111._4_4_ * auVar96._4_4_;
      auVar33._0_4_ = auVar111._0_4_ * auVar96._0_4_;
      auVar33._8_4_ = auVar111._8_4_ * auVar96._8_4_;
      auVar33._12_4_ = auVar111._12_4_ * auVar96._12_4_;
      auVar33._16_4_ = auVar111._16_4_ * auVar96._16_4_;
      auVar33._20_4_ = auVar111._20_4_ * auVar96._20_4_;
      auVar33._24_4_ = auVar111._24_4_ * auVar96._24_4_;
      auVar33._28_4_ = auVar98._28_4_;
      auVar34._4_4_ = -auVar110._4_4_ * auVar96._4_4_;
      auVar34._0_4_ = -auVar110._0_4_ * auVar96._0_4_;
      auVar34._8_4_ = -auVar110._8_4_ * auVar96._8_4_;
      auVar34._12_4_ = -auVar110._12_4_ * auVar96._12_4_;
      auVar34._16_4_ = -fVar180 * auVar96._16_4_;
      auVar34._20_4_ = -fVar172 * auVar96._20_4_;
      auVar34._24_4_ = -fVar161 * auVar96._24_4_;
      auVar34._28_4_ = auVar97._28_4_;
      auVar96 = vmulps_avx512vl(auVar96,auVar94);
      auVar91 = vfmadd213ps_fma(auVar30,auVar93,auVar102);
      auVar86 = vfmadd213ps_fma(auVar31,auVar93,auVar103);
      auVar97 = vfmadd213ps_avx512vl(auVar100,auVar93,auVar107);
      auVar98 = vfmadd213ps_avx512vl(auVar33,ZEXT1632(auVar174),ZEXT1632(auVar166));
      auVar165 = vfnmadd213ps_fma(auVar30,auVar93,auVar102);
      auVar106 = ZEXT1632(auVar174);
      auVar87 = vfmadd213ps_fma(auVar34,auVar106,ZEXT1632(auVar173));
      auVar88 = vfnmadd213ps_fma(auVar31,auVar93,auVar103);
      auVar85 = vfmadd213ps_fma(auVar96,auVar106,auVar101);
      auVar99 = vfnmadd231ps_avx512vl(auVar107,auVar93,auVar100);
      auVar166 = vfnmadd213ps_fma(auVar33,auVar106,ZEXT1632(auVar166));
      auVar173 = vfnmadd213ps_fma(auVar34,auVar106,ZEXT1632(auVar173));
      auVar202 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar174),auVar96);
      auVar96 = vsubps_avx512vl(auVar98,ZEXT1632(auVar165));
      auVar100 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar85),auVar99);
      auVar107 = vmulps_avx512vl(auVar100,auVar99);
      auVar84 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar88),auVar101);
      auVar35._4_4_ = auVar165._4_4_ * auVar101._4_4_;
      auVar35._0_4_ = auVar165._0_4_ * auVar101._0_4_;
      auVar35._8_4_ = auVar165._8_4_ * auVar101._8_4_;
      auVar35._12_4_ = auVar165._12_4_ * auVar101._12_4_;
      auVar35._16_4_ = auVar101._16_4_ * 0.0;
      auVar35._20_4_ = auVar101._20_4_ * 0.0;
      auVar35._24_4_ = auVar101._24_4_ * 0.0;
      auVar35._28_4_ = auVar101._28_4_;
      auVar101 = vfmsub231ps_avx512vl(auVar35,auVar99,auVar96);
      auVar36._4_4_ = auVar88._4_4_ * auVar96._4_4_;
      auVar36._0_4_ = auVar88._0_4_ * auVar96._0_4_;
      auVar36._8_4_ = auVar88._8_4_ * auVar96._8_4_;
      auVar36._12_4_ = auVar88._12_4_ * auVar96._12_4_;
      auVar36._16_4_ = auVar96._16_4_ * 0.0;
      auVar36._20_4_ = auVar96._20_4_ * 0.0;
      auVar36._24_4_ = auVar96._24_4_ * 0.0;
      auVar36._28_4_ = auVar96._28_4_;
      auVar7 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar165),auVar100);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar94,auVar101);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,ZEXT1632(auVar84));
      auVar95 = ZEXT1632(auVar89);
      uVar70 = vcmpps_avx512vl(auVar100,auVar95,2);
      bVar68 = (byte)uVar70;
      fVar81 = (float)((uint)(bVar68 & 1) * auVar91._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar166._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar133 = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar166._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar135 = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar166._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar138 = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar166._12_4_);
      auVar107 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar81))));
      fVar82 = (float)((uint)(bVar68 & 1) * auVar86._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar173._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar134 = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar173._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar136 = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar173._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar139 = (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar173._12_4_);
      auVar106 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar82))));
      auVar112._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar202._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar202._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar202._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar202._12_4_);
      fVar160 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar97._16_4_);
      auVar112._16_4_ = fVar160;
      fVar159 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar97._20_4_);
      auVar112._20_4_ = fVar159;
      fVar164 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar97._24_4_);
      auVar112._24_4_ = fVar164;
      iVar1 = (uint)(byte)(uVar70 >> 7) * auVar97._28_4_;
      auVar112._28_4_ = iVar1;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar165),auVar98);
      auVar113._0_4_ =
           (uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar86._0_4_;
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar86._4_4_;
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar86._8_4_;
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar86._12_4_;
      auVar113._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar96._16_4_;
      auVar113._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar96._20_4_;
      auVar113._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar96._24_4_;
      auVar113._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar87));
      auVar114._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar84._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar84._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar84._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar84._12_4_);
      fVar180 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar96._16_4_);
      auVar114._16_4_ = fVar180;
      fVar172 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar96._20_4_);
      auVar114._20_4_ = fVar172;
      fVar161 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar96._24_4_);
      auVar114._24_4_ = fVar161;
      auVar114._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(auVar99,ZEXT1632(auVar85));
      auVar115._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar97._0_4_);
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar97._4_4_);
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar97._8_4_);
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar97._12_4_);
      bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar115._16_4_ = (float)((uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar97._16_4_);
      bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar115._20_4_ = (float)((uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar97._20_4_);
      bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar115._24_4_ = (float)((uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar97._24_4_);
      bVar12 = SUB81(uVar70 >> 7,0);
      auVar115._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar97._28_4_;
      auVar116._0_4_ =
           (uint)(bVar68 & 1) * (int)auVar165._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar98._0_4_;
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar12 * (int)auVar165._4_4_ | (uint)!bVar12 * auVar98._4_4_;
      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar12 * (int)auVar165._8_4_ | (uint)!bVar12 * auVar98._8_4_;
      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar12 * (int)auVar165._12_4_ | (uint)!bVar12 * auVar98._12_4_;
      auVar116._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_;
      auVar116._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_;
      auVar116._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_;
      auVar116._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar98._28_4_;
      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar117._0_4_ =
           (uint)(bVar68 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar85._0_4_;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar85._4_4_;
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar85._8_4_;
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar85._12_4_;
      auVar117._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar99._16_4_;
      auVar117._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar99._20_4_;
      auVar117._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar99._24_4_;
      iVar2 = (uint)(byte)(uVar70 >> 7) * auVar99._28_4_;
      auVar117._28_4_ = iVar2;
      auVar102 = vsubps_avx512vl(auVar116,auVar107);
      auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar88._12_4_ |
                                              (uint)!bVar15 * auVar87._12_4_,
                                              CONCAT48((uint)bVar14 * (int)auVar88._8_4_ |
                                                       (uint)!bVar14 * auVar87._8_4_,
                                                       CONCAT44((uint)bVar12 * (int)auVar88._4_4_ |
                                                                (uint)!bVar12 * auVar87._4_4_,
                                                                (uint)(bVar68 & 1) *
                                                                (int)auVar88._0_4_ |
                                                                (uint)!(bool)(bVar68 & 1) *
                                                                auVar87._0_4_)))),auVar106);
      auVar197 = ZEXT3264(auVar96);
      auVar97 = vsubps_avx(auVar117,auVar112);
      auVar98 = vsubps_avx(auVar107,auVar113);
      auVar200 = ZEXT3264(auVar98);
      auVar99 = vsubps_avx(auVar106,auVar114);
      auVar101 = vsubps_avx(auVar112,auVar115);
      auVar37._4_4_ = auVar97._4_4_ * fVar133;
      auVar37._0_4_ = auVar97._0_4_ * fVar81;
      auVar37._8_4_ = auVar97._8_4_ * fVar135;
      auVar37._12_4_ = auVar97._12_4_ * fVar138;
      auVar37._16_4_ = auVar97._16_4_ * 0.0;
      auVar37._20_4_ = auVar97._20_4_ * 0.0;
      auVar37._24_4_ = auVar97._24_4_ * 0.0;
      auVar37._28_4_ = iVar2;
      auVar91 = vfmsub231ps_fma(auVar37,auVar112,auVar102);
      auVar38._4_4_ = fVar134 * auVar102._4_4_;
      auVar38._0_4_ = fVar82 * auVar102._0_4_;
      auVar38._8_4_ = fVar136 * auVar102._8_4_;
      auVar38._12_4_ = fVar139 * auVar102._12_4_;
      auVar38._16_4_ = auVar102._16_4_ * 0.0;
      auVar38._20_4_ = auVar102._20_4_ * 0.0;
      auVar38._24_4_ = auVar102._24_4_ * 0.0;
      auVar38._28_4_ = auVar100._28_4_;
      auVar86 = vfmsub231ps_fma(auVar38,auVar107,auVar96);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar95,ZEXT1632(auVar91));
      auVar182._0_4_ = auVar96._0_4_ * auVar112._0_4_;
      auVar182._4_4_ = auVar96._4_4_ * auVar112._4_4_;
      auVar182._8_4_ = auVar96._8_4_ * auVar112._8_4_;
      auVar182._12_4_ = auVar96._12_4_ * auVar112._12_4_;
      auVar182._16_4_ = auVar96._16_4_ * fVar160;
      auVar182._20_4_ = auVar96._20_4_ * fVar159;
      auVar182._24_4_ = auVar96._24_4_ * fVar164;
      auVar182._28_4_ = 0;
      auVar91 = vfmsub231ps_fma(auVar182,auVar106,auVar97);
      auVar103 = vfmadd231ps_avx512vl(auVar100,auVar95,ZEXT1632(auVar91));
      auVar100 = vmulps_avx512vl(auVar101,auVar113);
      auVar100 = vfmsub231ps_avx512vl(auVar100,auVar98,auVar115);
      auVar39._4_4_ = auVar99._4_4_ * auVar115._4_4_;
      auVar39._0_4_ = auVar99._0_4_ * auVar115._0_4_;
      auVar39._8_4_ = auVar99._8_4_ * auVar115._8_4_;
      auVar39._12_4_ = auVar99._12_4_ * auVar115._12_4_;
      auVar39._16_4_ = auVar99._16_4_ * auVar115._16_4_;
      auVar39._20_4_ = auVar99._20_4_ * auVar115._20_4_;
      auVar39._24_4_ = auVar99._24_4_ * auVar115._24_4_;
      auVar39._28_4_ = auVar115._28_4_;
      auVar91 = vfmsub231ps_fma(auVar39,auVar114,auVar101);
      auVar183._0_4_ = auVar114._0_4_ * auVar98._0_4_;
      auVar183._4_4_ = auVar114._4_4_ * auVar98._4_4_;
      auVar183._8_4_ = auVar114._8_4_ * auVar98._8_4_;
      auVar183._12_4_ = auVar114._12_4_ * auVar98._12_4_;
      auVar183._16_4_ = fVar180 * auVar98._16_4_;
      auVar183._20_4_ = fVar172 * auVar98._20_4_;
      auVar183._24_4_ = fVar161 * auVar98._24_4_;
      auVar183._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar183,auVar99,auVar113);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar95,auVar100);
      auVar94 = vfmadd231ps_avx512vl(auVar100,auVar95,ZEXT1632(auVar91));
      auVar188 = ZEXT3264(auVar94);
      auVar100 = vmaxps_avx(auVar103,auVar94);
      uVar162 = vcmpps_avx512vl(auVar100,auVar95,2);
      bVar79 = bVar79 & (byte)uVar162;
      if (bVar79 != 0) {
        auVar40._4_4_ = auVar101._4_4_ * auVar96._4_4_;
        auVar40._0_4_ = auVar101._0_4_ * auVar96._0_4_;
        auVar40._8_4_ = auVar101._8_4_ * auVar96._8_4_;
        auVar40._12_4_ = auVar101._12_4_ * auVar96._12_4_;
        auVar40._16_4_ = auVar101._16_4_ * auVar96._16_4_;
        auVar40._20_4_ = auVar101._20_4_ * auVar96._20_4_;
        auVar40._24_4_ = auVar101._24_4_ * auVar96._24_4_;
        auVar40._28_4_ = auVar100._28_4_;
        auVar85 = vfmsub231ps_fma(auVar40,auVar99,auVar97);
        auVar41._4_4_ = auVar97._4_4_ * auVar98._4_4_;
        auVar41._0_4_ = auVar97._0_4_ * auVar98._0_4_;
        auVar41._8_4_ = auVar97._8_4_ * auVar98._8_4_;
        auVar41._12_4_ = auVar97._12_4_ * auVar98._12_4_;
        auVar41._16_4_ = auVar97._16_4_ * auVar98._16_4_;
        auVar41._20_4_ = auVar97._20_4_ * auVar98._20_4_;
        auVar41._24_4_ = auVar97._24_4_ * auVar98._24_4_;
        auVar41._28_4_ = auVar97._28_4_;
        auVar87 = vfmsub231ps_fma(auVar41,auVar102,auVar101);
        auVar42._4_4_ = auVar99._4_4_ * auVar102._4_4_;
        auVar42._0_4_ = auVar99._0_4_ * auVar102._0_4_;
        auVar42._8_4_ = auVar99._8_4_ * auVar102._8_4_;
        auVar42._12_4_ = auVar99._12_4_ * auVar102._12_4_;
        auVar42._16_4_ = auVar99._16_4_ * auVar102._16_4_;
        auVar42._20_4_ = auVar99._20_4_ * auVar102._20_4_;
        auVar42._24_4_ = auVar99._24_4_ * auVar102._24_4_;
        auVar42._28_4_ = auVar99._28_4_;
        auVar84 = vfmsub231ps_fma(auVar42,auVar98,auVar96);
        auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar84));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar100 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
        auVar200 = ZEXT3264(auVar100);
        auVar96 = vfnmadd213ps_avx512vl(auVar100,ZEXT1632(auVar86),auVar105);
        auVar91 = vfmadd132ps_fma(auVar96,auVar100,auVar100);
        auVar197 = ZEXT1664(auVar91);
        auVar43._4_4_ = auVar84._4_4_ * auVar112._4_4_;
        auVar43._0_4_ = auVar84._0_4_ * auVar112._0_4_;
        auVar43._8_4_ = auVar84._8_4_ * auVar112._8_4_;
        auVar43._12_4_ = auVar84._12_4_ * auVar112._12_4_;
        auVar43._16_4_ = fVar160 * 0.0;
        auVar43._20_4_ = fVar159 * 0.0;
        auVar43._24_4_ = fVar164 * 0.0;
        auVar43._28_4_ = iVar1;
        auVar87 = vfmadd231ps_fma(auVar43,auVar106,ZEXT1632(auVar87));
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar107,ZEXT1632(auVar85));
        fVar164 = auVar91._0_4_;
        fVar159 = auVar91._4_4_;
        fVar160 = auVar91._8_4_;
        fVar161 = auVar91._12_4_;
        local_560 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar161,
                                       CONCAT48(auVar87._8_4_ * fVar160,
                                                CONCAT44(auVar87._4_4_ * fVar159,
                                                         auVar87._0_4_ * fVar164))));
        auVar201 = ZEXT3264(local_560);
        auVar149._4_4_ = uVar71;
        auVar149._0_4_ = uVar71;
        auVar149._8_4_ = uVar71;
        auVar149._12_4_ = uVar71;
        auVar149._16_4_ = uVar71;
        auVar149._20_4_ = uVar71;
        auVar149._24_4_ = uVar71;
        auVar149._28_4_ = uVar71;
        uVar162 = vcmpps_avx512vl(auVar149,local_560,2);
        uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar21._4_4_ = uVar143;
        auVar21._0_4_ = uVar143;
        auVar21._8_4_ = uVar143;
        auVar21._12_4_ = uVar143;
        auVar21._16_4_ = uVar143;
        auVar21._20_4_ = uVar143;
        auVar21._24_4_ = uVar143;
        auVar21._28_4_ = uVar143;
        uVar20 = vcmpps_avx512vl(local_560,auVar21,2);
        bVar79 = (byte)uVar162 & (byte)uVar20 & bVar79;
        if (bVar79 != 0) {
          uVar80 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar80 = bVar79 & uVar80;
          if ((char)uVar80 != '\0') {
            fVar172 = auVar103._0_4_ * fVar164;
            fVar180 = auVar103._4_4_ * fVar159;
            auVar44._4_4_ = fVar180;
            auVar44._0_4_ = fVar172;
            fVar81 = auVar103._8_4_ * fVar160;
            auVar44._8_4_ = fVar81;
            fVar82 = auVar103._12_4_ * fVar161;
            auVar44._12_4_ = fVar82;
            fVar133 = auVar103._16_4_ * 0.0;
            auVar44._16_4_ = fVar133;
            fVar134 = auVar103._20_4_ * 0.0;
            auVar44._20_4_ = fVar134;
            fVar135 = auVar103._24_4_ * 0.0;
            auVar44._24_4_ = fVar135;
            auVar44._28_4_ = auVar103._28_4_;
            auVar100 = vsubps_avx512vl(auVar105,auVar44);
            local_400._0_4_ =
                 (float)((uint)(bVar68 & 1) * (int)fVar172 |
                        (uint)!(bool)(bVar68 & 1) * auVar100._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            local_400._4_4_ = (float)((uint)bVar12 * (int)fVar180 | (uint)!bVar12 * auVar100._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            local_400._8_4_ = (float)((uint)bVar12 * (int)fVar81 | (uint)!bVar12 * auVar100._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            local_400._12_4_ = (float)((uint)bVar12 * (int)fVar82 | (uint)!bVar12 * auVar100._12_4_)
            ;
            bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
            local_400._16_4_ =
                 (float)((uint)bVar12 * (int)fVar133 | (uint)!bVar12 * auVar100._16_4_);
            bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
            local_400._20_4_ =
                 (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar100._20_4_);
            bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
            local_400._24_4_ =
                 (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar100._24_4_);
            bVar12 = SUB81(uVar70 >> 7,0);
            local_400._28_4_ =
                 (float)((uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar100._28_4_);
            auVar100 = vsubps_avx(ZEXT1632(auVar174),auVar93);
            auVar91 = vfmadd213ps_fma(auVar100,local_400,auVar93);
            uVar143 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar22._4_4_ = uVar143;
            auVar22._0_4_ = uVar143;
            auVar22._8_4_ = uVar143;
            auVar22._12_4_ = uVar143;
            auVar22._16_4_ = uVar143;
            auVar22._20_4_ = uVar143;
            auVar22._24_4_ = uVar143;
            auVar22._28_4_ = uVar143;
            auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                          CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                                   CONCAT44(auVar91._4_4_ +
                                                                            auVar91._4_4_,
                                                                            auVar91._0_4_ +
                                                                            auVar91._0_4_)))),
                                       auVar22);
            uVar73 = vcmpps_avx512vl(local_560,auVar100,6);
            uVar80 = uVar80 & uVar73;
            bVar79 = (byte)uVar80;
            if (bVar79 != 0) {
              auVar171._0_4_ = auVar94._0_4_ * fVar164;
              auVar171._4_4_ = auVar94._4_4_ * fVar159;
              auVar171._8_4_ = auVar94._8_4_ * fVar160;
              auVar171._12_4_ = auVar94._12_4_ * fVar161;
              auVar171._16_4_ = auVar94._16_4_ * 0.0;
              auVar171._20_4_ = auVar94._20_4_ * 0.0;
              auVar171._24_4_ = auVar94._24_4_ * 0.0;
              auVar171._28_4_ = 0;
              auVar100 = vsubps_avx512vl(auVar105,auVar171);
              auVar118._0_4_ =
                   (uint)(bVar68 & 1) * (int)auVar171._0_4_ |
                   (uint)!(bool)(bVar68 & 1) * auVar100._0_4_;
              bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar118._4_4_ = (uint)bVar12 * (int)auVar171._4_4_ | (uint)!bVar12 * auVar100._4_4_;
              bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar118._8_4_ = (uint)bVar12 * (int)auVar171._8_4_ | (uint)!bVar12 * auVar100._8_4_;
              bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar118._12_4_ =
                   (uint)bVar12 * (int)auVar171._12_4_ | (uint)!bVar12 * auVar100._12_4_;
              bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar118._16_4_ =
                   (uint)bVar12 * (int)auVar171._16_4_ | (uint)!bVar12 * auVar100._16_4_;
              bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar118._20_4_ =
                   (uint)bVar12 * (int)auVar171._20_4_ | (uint)!bVar12 * auVar100._20_4_;
              bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar118._24_4_ =
                   (uint)bVar12 * (int)auVar171._24_4_ | (uint)!bVar12 * auVar100._24_4_;
              auVar118._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar100._28_4_;
              auVar23._8_4_ = 0x40000000;
              auVar23._0_8_ = 0x4000000040000000;
              auVar23._12_4_ = 0x40000000;
              auVar23._16_4_ = 0x40000000;
              auVar23._20_4_ = 0x40000000;
              auVar23._24_4_ = 0x40000000;
              auVar23._28_4_ = 0x40000000;
              local_3e0 = vfmsub132ps_avx512vl(auVar118,auVar105,auVar23);
              local_3a0 = 0;
              auVar200 = ZEXT1664(auVar83);
              local_380 = local_680;
              uStack_378 = uStack_678;
              local_370 = local_690;
              uStack_368 = uStack_688;
              local_360 = local_6a0;
              uStack_358 = uStack_698;
              if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar164 = 1.0 / auVar205._0_4_;
                local_340[0] = fVar164 * (local_400._0_4_ + 0.0);
                local_340[1] = fVar164 * (local_400._4_4_ + 1.0);
                local_340[2] = fVar164 * (local_400._8_4_ + 2.0);
                local_340[3] = fVar164 * (local_400._12_4_ + 3.0);
                fStack_330 = fVar164 * (local_400._16_4_ + 4.0);
                fStack_32c = fVar164 * (local_400._20_4_ + 5.0);
                fStack_328 = fVar164 * (local_400._24_4_ + 6.0);
                fStack_324 = local_400._28_4_ + 7.0;
                local_320 = local_3e0;
                local_300 = local_560;
                auVar150._8_4_ = 0x7f800000;
                auVar150._0_8_ = 0x7f8000007f800000;
                auVar150._12_4_ = 0x7f800000;
                auVar150._16_4_ = 0x7f800000;
                auVar150._20_4_ = 0x7f800000;
                auVar150._24_4_ = 0x7f800000;
                auVar150._28_4_ = 0x7f800000;
                auVar100 = vblendmps_avx512vl(auVar150,local_560);
                auVar119._0_4_ =
                     (uint)(bVar79 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar119._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar119._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar119._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar119._16_4_ = (uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar119._20_4_ = (uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar119._24_4_ = (uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar80 >> 7,0);
                auVar119._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar100 = vshufps_avx(auVar119,auVar119,0xb1);
                auVar100 = vminps_avx(auVar119,auVar100);
                auVar96 = vshufpd_avx(auVar100,auVar100,5);
                auVar100 = vminps_avx(auVar100,auVar96);
                auVar96 = vpermpd_avx2(auVar100,0x4e);
                auVar100 = vminps_avx(auVar100,auVar96);
                uVar162 = vcmpps_avx512vl(auVar119,auVar100,0);
                uVar71 = (uint)uVar80;
                if ((bVar79 & (byte)uVar162) != 0) {
                  uVar71 = (uint)(bVar79 & (byte)uVar162);
                }
                uVar72 = 0;
                for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                  uVar72 = uVar72 + 1;
                }
                uVar70 = (ulong)uVar72;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_540 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uStack_53c = 0;
                  uStack_538 = 0;
                  uStack_534 = 0;
                  local_5a0 = auVar92;
                  local_3c0 = local_560;
                  local_39c = iVar9;
                  local_390 = auVar83;
                  do {
                    local_1c0 = local_340[uVar70];
                    local_1a0 = *(undefined4 *)(local_320 + uVar70 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                    local_670.context = context->user;
                    fVar159 = 1.0 - local_1c0;
                    fVar164 = fVar159 * fVar159 * -3.0;
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                              ZEXT416((uint)(local_1c0 * fVar159)),
                                              ZEXT416(0xc0000000));
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar159)),
                                              ZEXT416((uint)(local_1c0 * local_1c0)),
                                              ZEXT416(0x40000000));
                    fVar159 = auVar91._0_4_ * 3.0;
                    fVar160 = auVar86._0_4_ * 3.0;
                    fVar161 = local_1c0 * local_1c0 * 3.0;
                    auVar193._0_4_ = fVar161 * fVar142;
                    auVar193._4_4_ = fVar161 * fVar156;
                    auVar193._8_4_ = fVar161 * fVar157;
                    auVar193._12_4_ = fVar161 * fVar158;
                    auVar146._4_4_ = fVar160;
                    auVar146._0_4_ = fVar160;
                    auVar146._8_4_ = fVar160;
                    auVar146._12_4_ = fVar160;
                    auVar91 = vfmadd132ps_fma(auVar146,auVar193,auVar6);
                    auVar178._4_4_ = fVar159;
                    auVar178._0_4_ = fVar159;
                    auVar178._8_4_ = fVar159;
                    auVar178._12_4_ = fVar159;
                    auVar91 = vfmadd132ps_fma(auVar178,auVar91,auVar19);
                    auVar147._4_4_ = fVar164;
                    auVar147._0_4_ = fVar164;
                    auVar147._8_4_ = fVar164;
                    auVar147._12_4_ = fVar164;
                    auVar91 = vfmadd213ps_fma(auVar147,auVar83,auVar91);
                    local_220 = auVar91._0_4_;
                    auVar187._8_4_ = 1;
                    auVar187._0_8_ = 0x100000001;
                    auVar187._12_4_ = 1;
                    auVar187._16_4_ = 1;
                    auVar187._20_4_ = 1;
                    auVar187._24_4_ = 1;
                    auVar187._28_4_ = 1;
                    local_200 = vpermps_avx2(auVar187,ZEXT1632(auVar91));
                    auVar188 = ZEXT3264(local_200);
                    auVar194._8_4_ = 2;
                    auVar194._0_8_ = 0x200000002;
                    auVar194._12_4_ = 2;
                    auVar196._16_4_ = 2;
                    auVar196._0_16_ = auVar194;
                    auVar196._20_4_ = 2;
                    auVar196._24_4_ = 2;
                    auVar196._28_4_ = 2;
                    auVar197 = ZEXT3264(auVar196);
                    local_1e0 = vpermps_avx2(auVar196,ZEXT1632(auVar91));
                    iStack_21c = local_220;
                    iStack_218 = local_220;
                    iStack_214 = local_220;
                    iStack_210 = local_220;
                    iStack_20c = local_220;
                    iStack_208 = local_220;
                    iStack_204 = local_220;
                    fStack_1bc = local_1c0;
                    fStack_1b8 = local_1c0;
                    fStack_1b4 = local_1c0;
                    fStack_1b0 = local_1c0;
                    fStack_1ac = local_1c0;
                    fStack_1a8 = local_1c0;
                    fStack_1a4 = local_1c0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_2c0._0_8_;
                    uStack_178 = local_2c0._8_8_;
                    uStack_170 = local_2c0._16_8_;
                    uStack_168 = local_2c0._24_8_;
                    local_160 = local_2a0;
                    auVar100 = vpcmpeqd_avx2(local_2a0,local_2a0);
                    local_608[1] = auVar100;
                    *local_608 = auVar100;
                    local_140 = (local_670.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_670.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_5e0 = local_2e0;
                    local_670.valid = (int *)local_5e0;
                    local_670.geometryUserPtr = *(void **)(local_600._0_8_ + 0x18);
                    local_670.hit = (RTCHitN *)&local_220;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (*(code **)(local_600._0_8_ + 0x40) != (code *)0x0) {
                      auVar188 = ZEXT1664(local_200._0_16_);
                      auVar197 = ZEXT1664(auVar194);
                      (**(code **)(local_600._0_8_ + 0x40))(&local_670);
                      auVar201 = ZEXT3264(local_560);
                      auVar213 = ZEXT3264(local_5a0);
                      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar216 = ZEXT1664(auVar91);
                      auVar215 = ZEXT3264(local_520);
                      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar214 = ZEXT3264(auVar100);
                      ray = local_610;
                    }
                    if (local_5e0 == (undefined1  [32])0x0) {
LAB_019b8553:
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_540;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_600._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar188 = ZEXT1664(auVar188._0_16_);
                        auVar197 = ZEXT1664(auVar197._0_16_);
                        (*p_Var11)(&local_670);
                        auVar201 = ZEXT3264(local_560);
                        auVar213 = ZEXT3264(local_5a0);
                        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar216 = ZEXT1664(auVar91);
                        auVar215 = ZEXT3264(local_520);
                        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar214 = ZEXT3264(auVar100);
                        ray = local_610;
                      }
                      if (local_5e0 == (undefined1  [32])0x0) goto LAB_019b8553;
                      uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                      iVar1 = *(int *)(local_670.hit + 4);
                      iVar2 = *(int *)(local_670.hit + 8);
                      iVar62 = *(int *)(local_670.hit + 0xc);
                      iVar63 = *(int *)(local_670.hit + 0x10);
                      iVar64 = *(int *)(local_670.hit + 0x14);
                      iVar65 = *(int *)(local_670.hit + 0x18);
                      iVar66 = *(int *)(local_670.hit + 0x1c);
                      bVar79 = (byte)uVar73;
                      bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                      bVar18 = SUB81(uVar73 >> 7,0);
                      *(uint *)(local_670.ray + 0x180) =
                           (uint)(bVar79 & 1) * *(int *)local_670.hit |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x180);
                      *(uint *)(local_670.ray + 0x184) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x184);
                      *(uint *)(local_670.ray + 0x188) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x188);
                      *(uint *)(local_670.ray + 0x18c) =
                           (uint)bVar14 * iVar62 | (uint)!bVar14 * *(int *)(local_670.ray + 0x18c);
                      *(uint *)(local_670.ray + 400) =
                           (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_670.ray + 400);
                      *(uint *)(local_670.ray + 0x194) =
                           (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_670.ray + 0x194);
                      *(uint *)(local_670.ray + 0x198) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_670.ray + 0x198);
                      *(uint *)(local_670.ray + 0x19c) =
                           (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_670.ray + 0x19c);
                      iVar1 = *(int *)(local_670.hit + 0x24);
                      iVar2 = *(int *)(local_670.hit + 0x28);
                      iVar62 = *(int *)(local_670.hit + 0x2c);
                      iVar63 = *(int *)(local_670.hit + 0x30);
                      iVar64 = *(int *)(local_670.hit + 0x34);
                      iVar65 = *(int *)(local_670.hit + 0x38);
                      iVar66 = *(int *)(local_670.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                      bVar18 = SUB81(uVar73 >> 7,0);
                      *(uint *)(local_670.ray + 0x1a0) =
                           (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x20) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x1a0);
                      *(uint *)(local_670.ray + 0x1a4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1a4);
                      *(uint *)(local_670.ray + 0x1a8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1a8);
                      *(uint *)(local_670.ray + 0x1ac) =
                           (uint)bVar14 * iVar62 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1ac);
                      *(uint *)(local_670.ray + 0x1b0) =
                           (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1b0);
                      *(uint *)(local_670.ray + 0x1b4) =
                           (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1b4);
                      *(uint *)(local_670.ray + 0x1b8) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1b8);
                      *(uint *)(local_670.ray + 0x1bc) =
                           (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1bc);
                      iVar1 = *(int *)(local_670.hit + 0x44);
                      iVar2 = *(int *)(local_670.hit + 0x48);
                      iVar62 = *(int *)(local_670.hit + 0x4c);
                      iVar63 = *(int *)(local_670.hit + 0x50);
                      iVar64 = *(int *)(local_670.hit + 0x54);
                      iVar65 = *(int *)(local_670.hit + 0x58);
                      iVar66 = *(int *)(local_670.hit + 0x5c);
                      bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                      bVar18 = SUB81(uVar73 >> 7,0);
                      *(uint *)(local_670.ray + 0x1c0) =
                           (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x40) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x1c0);
                      *(uint *)(local_670.ray + 0x1c4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1c4);
                      *(uint *)(local_670.ray + 0x1c8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1c8);
                      *(uint *)(local_670.ray + 0x1cc) =
                           (uint)bVar14 * iVar62 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1cc);
                      *(uint *)(local_670.ray + 0x1d0) =
                           (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1d0);
                      *(uint *)(local_670.ray + 0x1d4) =
                           (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1d4);
                      *(uint *)(local_670.ray + 0x1d8) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1d8);
                      *(uint *)(local_670.ray + 0x1dc) =
                           (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1dc);
                      iVar1 = *(int *)(local_670.hit + 100);
                      iVar2 = *(int *)(local_670.hit + 0x68);
                      iVar62 = *(int *)(local_670.hit + 0x6c);
                      iVar63 = *(int *)(local_670.hit + 0x70);
                      iVar64 = *(int *)(local_670.hit + 0x74);
                      iVar65 = *(int *)(local_670.hit + 0x78);
                      iVar66 = *(int *)(local_670.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                      bVar18 = SUB81(uVar73 >> 7,0);
                      *(uint *)(local_670.ray + 0x1e0) =
                           (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x60) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x1e0);
                      *(uint *)(local_670.ray + 0x1e4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1e4);
                      *(uint *)(local_670.ray + 0x1e8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1e8);
                      *(uint *)(local_670.ray + 0x1ec) =
                           (uint)bVar14 * iVar62 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1ec);
                      *(uint *)(local_670.ray + 0x1f0) =
                           (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1f0);
                      *(uint *)(local_670.ray + 500) =
                           (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_670.ray + 500);
                      *(uint *)(local_670.ray + 0x1f8) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1f8);
                      *(uint *)(local_670.ray + 0x1fc) =
                           (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1fc);
                      iVar1 = *(int *)(local_670.hit + 0x84);
                      iVar2 = *(int *)(local_670.hit + 0x88);
                      iVar62 = *(int *)(local_670.hit + 0x8c);
                      iVar63 = *(int *)(local_670.hit + 0x90);
                      iVar64 = *(int *)(local_670.hit + 0x94);
                      iVar65 = *(int *)(local_670.hit + 0x98);
                      iVar66 = *(int *)(local_670.hit + 0x9c);
                      bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                      bVar18 = SUB81(uVar73 >> 7,0);
                      *(uint *)(local_670.ray + 0x200) =
                           (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x80) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x200);
                      *(uint *)(local_670.ray + 0x204) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x204);
                      *(uint *)(local_670.ray + 0x208) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x208);
                      *(uint *)(local_670.ray + 0x20c) =
                           (uint)bVar14 * iVar62 | (uint)!bVar14 * *(int *)(local_670.ray + 0x20c);
                      *(uint *)(local_670.ray + 0x210) =
                           (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_670.ray + 0x210);
                      *(uint *)(local_670.ray + 0x214) =
                           (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_670.ray + 0x214);
                      *(uint *)(local_670.ray + 0x218) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_670.ray + 0x218);
                      *(uint *)(local_670.ray + 0x21c) =
                           (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_670.ray + 0x21c);
                      auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                      *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar100;
                      auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                      *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar100;
                      auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                      *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar100;
                      auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                      *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar100;
                      local_540 = *(undefined4 *)(ray + k * 4 + 0x100);
                      uStack_53c = 0;
                      uStack_538 = 0;
                      uStack_534 = 0;
                    }
                    auVar92 = auVar213._0_32_;
                    bVar79 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar80;
                    auVar154._4_4_ = local_540;
                    auVar154._0_4_ = local_540;
                    auVar154._8_4_ = local_540;
                    auVar154._12_4_ = local_540;
                    auVar154._16_4_ = local_540;
                    auVar154._20_4_ = local_540;
                    auVar154._24_4_ = local_540;
                    auVar154._28_4_ = local_540;
                    uVar162 = vcmpps_avx512vl(auVar201._0_32_,auVar154,2);
                    if ((bVar79 & (byte)uVar162) == 0) goto LAB_019b746a;
                    bVar79 = bVar79 & (byte)uVar162;
                    uVar80 = (ulong)bVar79;
                    auVar155._8_4_ = 0x7f800000;
                    auVar155._0_8_ = 0x7f8000007f800000;
                    auVar155._12_4_ = 0x7f800000;
                    auVar155._16_4_ = 0x7f800000;
                    auVar155._20_4_ = 0x7f800000;
                    auVar155._24_4_ = 0x7f800000;
                    auVar155._28_4_ = 0x7f800000;
                    auVar100 = vblendmps_avx512vl(auVar155,auVar201._0_32_);
                    auVar132._0_4_ =
                         (uint)(bVar79 & 1) * auVar100._0_4_ |
                         (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar79 >> 1 & 1);
                    auVar132._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar79 >> 2 & 1);
                    auVar132._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar79 >> 3 & 1);
                    auVar132._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar79 >> 4 & 1);
                    auVar132._16_4_ = (uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar79 >> 5 & 1);
                    auVar132._20_4_ = (uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar79 >> 6 & 1);
                    auVar132._24_4_ = (uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar132._28_4_ =
                         (uint)(bVar79 >> 7) * auVar100._28_4_ |
                         (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                    auVar100 = vshufps_avx(auVar132,auVar132,0xb1);
                    auVar100 = vminps_avx(auVar132,auVar100);
                    auVar96 = vshufpd_avx(auVar100,auVar100,5);
                    auVar100 = vminps_avx(auVar100,auVar96);
                    auVar96 = vpermpd_avx2(auVar100,0x4e);
                    auVar100 = vminps_avx(auVar100,auVar96);
                    uVar162 = vcmpps_avx512vl(auVar132,auVar100,0);
                    bVar68 = (byte)uVar162 & bVar79;
                    if (bVar68 != 0) {
                      bVar79 = bVar68;
                    }
                    uVar71 = 0;
                    for (uVar72 = (uint)bVar79; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000
                        ) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar70 = (ulong)uVar71;
                  } while( true );
                }
                fVar164 = local_340[uVar70];
                uVar143 = *(undefined4 *)(local_320 + uVar70 * 4);
                fVar160 = 1.0 - fVar164;
                fVar159 = fVar160 * fVar160 * -3.0;
                auVar188 = ZEXT464((uint)fVar159);
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),
                                          ZEXT416((uint)(fVar164 * fVar160)),ZEXT416(0xc0000000));
                auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar164 * fVar160)),
                                          ZEXT416((uint)(fVar164 * fVar164)),ZEXT416(0x40000000));
                fVar160 = auVar91._0_4_ * 3.0;
                fVar161 = auVar86._0_4_ * 3.0;
                fVar172 = fVar164 * fVar164 * 3.0;
                auVar189._0_4_ = fVar172 * fVar142;
                auVar189._4_4_ = fVar172 * fVar156;
                auVar189._8_4_ = fVar172 * fVar157;
                auVar189._12_4_ = fVar172 * fVar158;
                auVar197 = ZEXT1664(auVar189);
                auVar167._4_4_ = fVar161;
                auVar167._0_4_ = fVar161;
                auVar167._8_4_ = fVar161;
                auVar167._12_4_ = fVar161;
                auVar91 = vfmadd132ps_fma(auVar167,auVar189,auVar6);
                auVar175._4_4_ = fVar160;
                auVar175._0_4_ = fVar160;
                auVar175._8_4_ = fVar160;
                auVar175._12_4_ = fVar160;
                auVar91 = vfmadd132ps_fma(auVar175,auVar91,auVar19);
                auVar168._4_4_ = fVar159;
                auVar168._0_4_ = fVar159;
                auVar168._8_4_ = fVar159;
                auVar168._12_4_ = fVar159;
                auVar91 = vfmadd213ps_fma(auVar168,auVar83,auVar91);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar91._0_4_;
                uVar10 = vextractps_avx(auVar91,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                uVar10 = vextractps_avx(auVar91,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                *(float *)(ray + k * 4 + 0x1e0) = fVar164;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar143;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                *(uint *)(ray + k * 4 + 0x240) = uVar8;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_019b746a:
                auVar200 = ZEXT1664(auVar83);
                uVar71 = local_640._0_4_;
              }
            }
          }
        }
      }
    }
    local_640._0_4_ = uVar71;
    if (8 < iVar9) {
      local_600 = vpbroadcastd_avx512vl();
      local_540 = local_630._0_4_;
      uStack_53c = local_630._0_4_;
      uStack_538 = local_630._0_4_;
      uStack_534 = local_630._0_4_;
      uStack_530 = local_630._0_4_;
      uStack_52c = local_630._0_4_;
      uStack_528 = local_630._0_4_;
      uStack_524 = local_630._0_4_;
      local_560._4_4_ = local_640._0_4_;
      local_560._0_4_ = local_640._0_4_;
      local_560._8_4_ = local_640._0_4_;
      local_560._12_4_ = local_640._0_4_;
      local_560._16_4_ = local_640._0_4_;
      local_560._20_4_ = local_640._0_4_;
      local_560._24_4_ = local_640._0_4_;
      local_560._28_4_ = local_640._0_4_;
      local_100 = 1.0 / (float)local_580._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar77 = 8;
      local_5a0 = auVar92;
LAB_019b7511:
      if (lVar77 < lVar74) {
        auVar100 = vpbroadcastd_avx512vl();
        auVar100 = vpor_avx2(auVar100,_DAT_01fb4ba0);
        uVar20 = vpcmpd_avx512vl(auVar100,local_600,1);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 * 4 + lVar78);
        auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21fb768 + lVar77 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar78 + 0x21fbbec + lVar77 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar78 + 0x21fc070 + lVar77 * 4);
        auVar213._0_4_ = auVar98._0_4_ * (float)local_4e0._0_4_;
        auVar213._4_4_ = auVar98._4_4_ * (float)local_4e0._4_4_;
        auVar213._8_4_ = auVar98._8_4_ * fStack_4d8;
        auVar213._12_4_ = auVar98._12_4_ * fStack_4d4;
        auVar213._16_4_ = auVar98._16_4_ * fStack_4d0;
        auVar213._20_4_ = auVar98._20_4_ * fStack_4cc;
        auVar213._28_36_ = auVar197._28_36_;
        auVar213._24_4_ = auVar98._24_4_ * fStack_4c8;
        auVar197._0_4_ = auVar98._0_4_ * (float)local_500._0_4_;
        auVar197._4_4_ = auVar98._4_4_ * (float)local_500._4_4_;
        auVar197._8_4_ = auVar98._8_4_ * fStack_4f8;
        auVar197._12_4_ = auVar98._12_4_ * fStack_4f4;
        auVar197._16_4_ = auVar98._16_4_ * fStack_4f0;
        auVar197._20_4_ = auVar98._20_4_ * fStack_4ec;
        auVar197._28_36_ = auVar188._28_36_;
        auVar197._24_4_ = auVar98._24_4_ * fStack_4e8;
        auVar99 = vmulps_avx512vl(local_e0,auVar98);
        auVar101 = vfmadd231ps_avx512vl(auVar213._0_32_,auVar97,local_4a0);
        auVar107 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar97,local_4c0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_c0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,local_460);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,local_480);
        auVar106 = vfmadd231ps_avx512vl(auVar99,auVar96,local_a0);
        auVar91 = vfmadd231ps_fma(auVar101,auVar100,local_420);
        auVar197 = ZEXT1664(auVar91);
        auVar86 = vfmadd231ps_fma(auVar107,auVar100,local_440);
        auVar188 = ZEXT1664(auVar86);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 * 4 + lVar78);
        auVar101 = *(undefined1 (*) [32])(lVar78 + 0x21fdb88 + lVar77 * 4);
        auVar94 = vfmadd231ps_avx512vl(auVar106,auVar100,local_80);
        auVar107 = *(undefined1 (*) [32])(lVar78 + 0x21fe00c + lVar77 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar78 + 0x21fe490 + lVar77 * 4);
        auVar201._0_4_ = auVar106._0_4_ * (float)local_4e0._0_4_;
        auVar201._4_4_ = auVar106._4_4_ * (float)local_4e0._4_4_;
        auVar201._8_4_ = auVar106._8_4_ * fStack_4d8;
        auVar201._12_4_ = auVar106._12_4_ * fStack_4d4;
        auVar201._16_4_ = auVar106._16_4_ * fStack_4d0;
        auVar201._20_4_ = auVar106._20_4_ * fStack_4cc;
        auVar201._28_36_ = auVar200._28_36_;
        auVar201._24_4_ = auVar106._24_4_ * fStack_4c8;
        auVar45._4_4_ = auVar106._4_4_ * (float)local_500._4_4_;
        auVar45._0_4_ = auVar106._0_4_ * (float)local_500._0_4_;
        auVar45._8_4_ = auVar106._8_4_ * fStack_4f8;
        auVar45._12_4_ = auVar106._12_4_ * fStack_4f4;
        auVar45._16_4_ = auVar106._16_4_ * fStack_4f0;
        auVar45._20_4_ = auVar106._20_4_ * fStack_4ec;
        auVar45._24_4_ = auVar106._24_4_ * fStack_4e8;
        auVar45._28_4_ = uStack_4e4;
        auVar102 = vmulps_avx512vl(local_e0,auVar106);
        auVar103 = vfmadd231ps_avx512vl(auVar201._0_32_,auVar107,local_4a0);
        auVar95 = vfmadd231ps_avx512vl(auVar45,auVar107,local_4c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_c0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,local_460);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_480);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_a0);
        auVar87 = vfmadd231ps_fma(auVar103,auVar99,local_420);
        auVar200 = ZEXT1664(auVar87);
        auVar85 = vfmadd231ps_fma(auVar95,auVar99,local_440);
        auVar95 = vfmadd231ps_avx512vl(auVar102,auVar99,local_80);
        auVar92 = vmaxps_avx512vl(auVar94,auVar95);
        auVar102 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar91));
        auVar103 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar86));
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar86),auVar102);
        auVar104 = vmulps_avx512vl(ZEXT1632(auVar91),auVar103);
        auVar93 = vsubps_avx512vl(auVar93,auVar104);
        auVar104 = vmulps_avx512vl(auVar103,auVar103);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar102);
        auVar92 = vmulps_avx512vl(auVar92,auVar92);
        auVar92 = vmulps_avx512vl(auVar92,auVar104);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        uVar162 = vcmpps_avx512vl(auVar93,auVar92,2);
        bVar79 = (byte)uVar20 & (byte)uVar162;
        if (bVar79 != 0) {
          auVar106 = vmulps_avx512vl(local_280,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_260,auVar106);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_240,auVar107);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_5a0,auVar101);
          auVar98 = vmulps_avx512vl(local_280,auVar98);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_260,auVar98);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_240,auVar97);
          auVar101 = vfmadd213ps_avx512vl(auVar100,local_5a0,auVar96);
          auVar100 = *(undefined1 (*) [32])(lVar78 + 0x21fc4f4 + lVar77 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21fc978 + lVar77 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar78 + 0x21fcdfc + lVar77 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar78 + 0x21fd280 + lVar77 * 4);
          auVar107 = vmulps_avx512vl(_local_4e0,auVar98);
          auVar106 = vmulps_avx512vl(_local_500,auVar98);
          auVar98 = vmulps_avx512vl(local_280,auVar98);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar97,local_4a0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,local_4c0);
          auVar97 = vfmadd231ps_avx512vl(auVar98,local_260,auVar97);
          auVar98 = vfmadd231ps_avx512vl(auVar107,auVar96,local_460);
          auVar107 = vfmadd231ps_avx512vl(auVar106,auVar96,local_480);
          auVar96 = vfmadd231ps_avx512vl(auVar97,local_240,auVar96);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,local_420);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,local_440);
          auVar84 = vfmadd231ps_fma(auVar96,auVar100,local_5a0);
          auVar100 = *(undefined1 (*) [32])(lVar78 + 0x21fe914 + lVar77 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21ff21c + lVar77 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar78 + 0x21ff6a0 + lVar77 * 4);
          auVar106 = vmulps_avx512vl(_local_4e0,auVar97);
          auVar92 = vmulps_avx512vl(_local_500,auVar97);
          auVar97 = vmulps_avx512vl(local_280,auVar97);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,local_4a0);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,local_4c0);
          auVar97 = vfmadd231ps_avx512vl(auVar97,local_260,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21fed98 + lVar77 * 4);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,local_460);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,local_480);
          auVar96 = vfmadd231ps_avx512vl(auVar97,local_240,auVar96);
          auVar97 = vfmadd231ps_avx512vl(auVar106,auVar100,local_420);
          auVar106 = vfmadd231ps_avx512vl(auVar92,auVar100,local_440);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_5a0,auVar100);
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar98,auVar92);
          vandps_avx512vl(auVar107,auVar92);
          auVar100 = vmaxps_avx(auVar92,auVar92);
          vandps_avx512vl(ZEXT1632(auVar84),auVar92);
          auVar100 = vmaxps_avx(auVar100,auVar92);
          auVar67._4_4_ = uStack_53c;
          auVar67._0_4_ = local_540;
          auVar67._8_4_ = uStack_538;
          auVar67._12_4_ = uStack_534;
          auVar67._16_4_ = uStack_530;
          auVar67._20_4_ = uStack_52c;
          auVar67._24_4_ = uStack_528;
          auVar67._28_4_ = uStack_524;
          uVar70 = vcmpps_avx512vl(auVar100,auVar67,1);
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar120._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar98._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar98._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar98._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar98._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar98._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar98._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar98._24_4_)
          ;
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar120._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar98._28_4_;
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar121._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar107._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar107._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar107._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar121._12_4_ =
               (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar107._12_4_);
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar121._16_4_ =
               (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar107._16_4_);
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar121._20_4_ =
               (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar107._20_4_);
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar121._24_4_ =
               (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar107._24_4_);
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar121._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar107._28_4_;
          vandps_avx512vl(auVar97,auVar92);
          vandps_avx512vl(auVar106,auVar92);
          auVar100 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar96,auVar92);
          auVar100 = vmaxps_avx(auVar100,auVar121);
          uVar70 = vcmpps_avx512vl(auVar100,auVar67,1);
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar122._0_4_ = (uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar97._0_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar97._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar97._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar97._12_4_;
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar97._16_4_;
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar97._20_4_;
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar97._24_4_;
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar97._28_4_;
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar123._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar106._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar106._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar106._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar106._12_4_);
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar106._16_4_);
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar106._20_4_);
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar106._24_4_);
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar123._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar106._28_4_;
          auVar204._8_4_ = 0x80000000;
          auVar204._0_8_ = 0x8000000080000000;
          auVar204._12_4_ = 0x80000000;
          auVar204._16_4_ = 0x80000000;
          auVar204._20_4_ = 0x80000000;
          auVar204._24_4_ = 0x80000000;
          auVar204._28_4_ = 0x80000000;
          auVar100 = vxorps_avx512vl(auVar122,auVar204);
          auVar90 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
          auVar96 = vfmadd213ps_avx512vl(auVar120,auVar120,ZEXT1632(auVar90));
          auVar84 = vfmadd231ps_fma(auVar96,auVar121,auVar121);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
          auVar212._8_4_ = 0xbf000000;
          auVar212._0_8_ = 0xbf000000bf000000;
          auVar212._12_4_ = 0xbf000000;
          auVar212._16_4_ = 0xbf000000;
          auVar212._20_4_ = 0xbf000000;
          auVar212._24_4_ = 0xbf000000;
          auVar212._28_4_ = 0xbf000000;
          fVar164 = auVar96._0_4_;
          fVar159 = auVar96._4_4_;
          fVar160 = auVar96._8_4_;
          fVar161 = auVar96._12_4_;
          fVar172 = auVar96._16_4_;
          fVar180 = auVar96._20_4_;
          fVar81 = auVar96._24_4_;
          auVar46._4_4_ = fVar159 * fVar159 * fVar159 * auVar84._4_4_ * -0.5;
          auVar46._0_4_ = fVar164 * fVar164 * fVar164 * auVar84._0_4_ * -0.5;
          auVar46._8_4_ = fVar160 * fVar160 * fVar160 * auVar84._8_4_ * -0.5;
          auVar46._12_4_ = fVar161 * fVar161 * fVar161 * auVar84._12_4_ * -0.5;
          auVar46._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar46._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
          auVar46._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
          auVar46._28_4_ = auVar121._28_4_;
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar46,auVar97,auVar96);
          auVar47._4_4_ = auVar121._4_4_ * auVar96._4_4_;
          auVar47._0_4_ = auVar121._0_4_ * auVar96._0_4_;
          auVar47._8_4_ = auVar121._8_4_ * auVar96._8_4_;
          auVar47._12_4_ = auVar121._12_4_ * auVar96._12_4_;
          auVar47._16_4_ = auVar121._16_4_ * auVar96._16_4_;
          auVar47._20_4_ = auVar121._20_4_ * auVar96._20_4_;
          auVar47._24_4_ = auVar121._24_4_ * auVar96._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar96._4_4_ * -auVar120._4_4_;
          auVar48._0_4_ = auVar96._0_4_ * -auVar120._0_4_;
          auVar48._8_4_ = auVar96._8_4_ * -auVar120._8_4_;
          auVar48._12_4_ = auVar96._12_4_ * -auVar120._12_4_;
          auVar48._16_4_ = auVar96._16_4_ * -auVar120._16_4_;
          auVar48._20_4_ = auVar96._20_4_ * -auVar120._20_4_;
          auVar48._24_4_ = auVar96._24_4_ * -auVar120._24_4_;
          auVar48._28_4_ = auVar121._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,ZEXT1632(auVar90));
          auVar106 = ZEXT1632(auVar90);
          auVar96 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar106);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar123,auVar123);
          auVar107 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar212);
          fVar164 = auVar107._0_4_;
          fVar159 = auVar107._4_4_;
          fVar160 = auVar107._8_4_;
          fVar161 = auVar107._12_4_;
          fVar172 = auVar107._16_4_;
          fVar180 = auVar107._20_4_;
          fVar81 = auVar107._24_4_;
          auVar49._4_4_ = fVar159 * fVar159 * fVar159 * auVar96._4_4_;
          auVar49._0_4_ = fVar164 * fVar164 * fVar164 * auVar96._0_4_;
          auVar49._8_4_ = fVar160 * fVar160 * fVar160 * auVar96._8_4_;
          auVar49._12_4_ = fVar161 * fVar161 * fVar161 * auVar96._12_4_;
          auVar49._16_4_ = fVar172 * fVar172 * fVar172 * auVar96._16_4_;
          auVar49._20_4_ = fVar180 * fVar180 * fVar180 * auVar96._20_4_;
          auVar49._24_4_ = fVar81 * fVar81 * fVar81 * auVar96._24_4_;
          auVar49._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar49,auVar97,auVar107);
          auVar50._4_4_ = auVar123._4_4_ * auVar96._4_4_;
          auVar50._0_4_ = auVar123._0_4_ * auVar96._0_4_;
          auVar50._8_4_ = auVar123._8_4_ * auVar96._8_4_;
          auVar50._12_4_ = auVar123._12_4_ * auVar96._12_4_;
          auVar50._16_4_ = auVar123._16_4_ * auVar96._16_4_;
          auVar50._20_4_ = auVar123._20_4_ * auVar96._20_4_;
          auVar50._24_4_ = auVar123._24_4_ * auVar96._24_4_;
          auVar50._28_4_ = auVar107._28_4_;
          auVar51._4_4_ = auVar96._4_4_ * auVar100._4_4_;
          auVar51._0_4_ = auVar96._0_4_ * auVar100._0_4_;
          auVar51._8_4_ = auVar96._8_4_ * auVar100._8_4_;
          auVar51._12_4_ = auVar96._12_4_ * auVar100._12_4_;
          auVar51._16_4_ = auVar96._16_4_ * auVar100._16_4_;
          auVar51._20_4_ = auVar96._20_4_ * auVar100._20_4_;
          auVar51._24_4_ = auVar96._24_4_ * auVar100._24_4_;
          auVar51._28_4_ = auVar100._28_4_;
          auVar100 = vmulps_avx512vl(auVar96,auVar106);
          auVar84 = vfmadd213ps_fma(auVar47,auVar94,ZEXT1632(auVar91));
          auVar7 = vfmadd213ps_fma(auVar48,auVar94,ZEXT1632(auVar86));
          auVar97 = vfmadd213ps_avx512vl(auVar98,auVar94,auVar101);
          auVar107 = vfmadd213ps_avx512vl(auVar50,auVar95,ZEXT1632(auVar87));
          auVar166 = vfnmadd213ps_fma(auVar47,auVar94,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar51,auVar95,ZEXT1632(auVar85));
          auVar173 = vfnmadd213ps_fma(auVar48,auVar94,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar100,auVar95,auVar99);
          auVar202 = vfnmadd231ps_fma(auVar101,auVar94,auVar98);
          auVar174 = vfnmadd213ps_fma(auVar50,auVar95,ZEXT1632(auVar87));
          auVar88 = vfnmadd213ps_fma(auVar51,auVar95,ZEXT1632(auVar85));
          auVar89 = vfnmadd231ps_fma(auVar99,auVar95,auVar100);
          auVar99 = vsubps_avx512vl(auVar107,ZEXT1632(auVar166));
          auVar100 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar173));
          auVar96 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar202));
          auVar52._4_4_ = auVar100._4_4_ * auVar202._4_4_;
          auVar52._0_4_ = auVar100._0_4_ * auVar202._0_4_;
          auVar52._8_4_ = auVar100._8_4_ * auVar202._8_4_;
          auVar52._12_4_ = auVar100._12_4_ * auVar202._12_4_;
          auVar52._16_4_ = auVar100._16_4_ * 0.0;
          auVar52._20_4_ = auVar100._20_4_ * 0.0;
          auVar52._24_4_ = auVar100._24_4_ * 0.0;
          auVar52._28_4_ = auVar98._28_4_;
          auVar87 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar173),auVar96);
          auVar53._4_4_ = auVar96._4_4_ * auVar166._4_4_;
          auVar53._0_4_ = auVar96._0_4_ * auVar166._0_4_;
          auVar53._8_4_ = auVar96._8_4_ * auVar166._8_4_;
          auVar53._12_4_ = auVar96._12_4_ * auVar166._12_4_;
          auVar53._16_4_ = auVar96._16_4_ * 0.0;
          auVar53._20_4_ = auVar96._20_4_ * 0.0;
          auVar53._24_4_ = auVar96._24_4_ * 0.0;
          auVar53._28_4_ = auVar96._28_4_;
          auVar85 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar202),auVar99);
          auVar54._4_4_ = auVar173._4_4_ * auVar99._4_4_;
          auVar54._0_4_ = auVar173._0_4_ * auVar99._0_4_;
          auVar54._8_4_ = auVar173._8_4_ * auVar99._8_4_;
          auVar54._12_4_ = auVar173._12_4_ * auVar99._12_4_;
          auVar54._16_4_ = auVar99._16_4_ * 0.0;
          auVar54._20_4_ = auVar99._20_4_ * 0.0;
          auVar54._24_4_ = auVar99._24_4_ * 0.0;
          auVar54._28_4_ = auVar99._28_4_;
          auVar165 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar166),auVar100);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar165),auVar106,ZEXT1632(auVar85));
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar87));
          auVar93 = ZEXT1632(auVar90);
          uVar70 = vcmpps_avx512vl(auVar100,auVar93,2);
          bVar68 = (byte)uVar70;
          fVar134 = (float)((uint)(bVar68 & 1) * auVar84._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar174._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar136 = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar174._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar139 = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar174._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar140 = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar174._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar136,fVar134))));
          fVar135 = (float)((uint)(bVar68 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar88._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar138 = (float)((uint)bVar12 * auVar7._4_4_ | (uint)!bVar12 * auVar88._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar137 = (float)((uint)bVar12 * auVar7._8_4_ | (uint)!bVar12 * auVar88._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar141 = (float)((uint)bVar12 * auVar7._12_4_ | (uint)!bVar12 * auVar88._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar137,CONCAT44(fVar138,fVar135))));
          auVar124._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar89._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar89._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar89._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar89._12_4_);
          fVar164 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar97._16_4_);
          auVar124._16_4_ = fVar164;
          fVar160 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar97._20_4_);
          auVar124._20_4_ = fVar160;
          fVar159 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar97._24_4_);
          auVar124._24_4_ = fVar159;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar97._28_4_;
          auVar124._28_4_ = iVar1;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar166),auVar107);
          auVar125._0_4_ =
               (uint)(bVar68 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar87._0_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar87._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar87._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar87._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar100._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar100._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar100._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar173),ZEXT1632(auVar91));
          auVar126._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar84._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar84._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar84._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar84._12_4_)
          ;
          fVar180 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar100._16_4_);
          auVar126._16_4_ = fVar180;
          fVar172 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar100._20_4_);
          auVar126._20_4_ = fVar172;
          fVar161 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar100._24_4_);
          auVar126._24_4_ = fVar161;
          auVar126._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar202),ZEXT1632(auVar86));
          auVar127._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar7._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar7._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar7._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar7._12_4_);
          fVar82 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar100._16_4_);
          auVar127._16_4_ = fVar82;
          fVar81 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar100._20_4_);
          auVar127._20_4_ = fVar81;
          fVar133 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar100._24_4_);
          auVar127._24_4_ = fVar133;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar100._28_4_;
          auVar127._28_4_ = iVar2;
          auVar128._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar166._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar107._0_4_
          ;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar12 * (int)auVar166._4_4_ | (uint)!bVar12 * auVar107._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar12 * (int)auVar166._8_4_ | (uint)!bVar12 * auVar107._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar12 * (int)auVar166._12_4_ | (uint)!bVar12 * auVar107._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar107._28_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar107 = vsubps_avx512vl(auVar128,auVar106);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar173._12_4_ |
                                                  (uint)!bVar16 * auVar91._12_4_,
                                                  CONCAT48((uint)bVar14 * (int)auVar173._8_4_ |
                                                           (uint)!bVar14 * auVar91._8_4_,
                                                           CONCAT44((uint)bVar12 *
                                                                    (int)auVar173._4_4_ |
                                                                    (uint)!bVar12 * auVar91._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar173._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar91._0_4_)))),auVar102);
          auVar197 = ZEXT3264(auVar96);
          auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar202._12_4_ |
                                                  (uint)!bVar17 * auVar86._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar202._8_4_ |
                                                           (uint)!bVar15 * auVar86._8_4_,
                                                           CONCAT44((uint)bVar13 *
                                                                    (int)auVar202._4_4_ |
                                                                    (uint)!bVar13 * auVar86._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar202._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar86._0_4_)))),auVar124);
          auVar98 = vsubps_avx(auVar106,auVar125);
          auVar200 = ZEXT3264(auVar98);
          auVar99 = vsubps_avx(auVar102,auVar126);
          auVar101 = vsubps_avx(auVar124,auVar127);
          auVar55._4_4_ = auVar97._4_4_ * fVar136;
          auVar55._0_4_ = auVar97._0_4_ * fVar134;
          auVar55._8_4_ = auVar97._8_4_ * fVar139;
          auVar55._12_4_ = auVar97._12_4_ * fVar140;
          auVar55._16_4_ = auVar97._16_4_ * 0.0;
          auVar55._20_4_ = auVar97._20_4_ * 0.0;
          auVar55._24_4_ = auVar97._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar55,auVar124,auVar107);
          auVar179._0_4_ = fVar135 * auVar107._0_4_;
          auVar179._4_4_ = fVar138 * auVar107._4_4_;
          auVar179._8_4_ = fVar137 * auVar107._8_4_;
          auVar179._12_4_ = fVar141 * auVar107._12_4_;
          auVar179._16_4_ = auVar107._16_4_ * 0.0;
          auVar179._20_4_ = auVar107._20_4_ * 0.0;
          auVar179._24_4_ = auVar107._24_4_ * 0.0;
          auVar179._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar179,auVar106,auVar96);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar93,ZEXT1632(auVar91));
          auVar184._0_4_ = auVar96._0_4_ * auVar124._0_4_;
          auVar184._4_4_ = auVar96._4_4_ * auVar124._4_4_;
          auVar184._8_4_ = auVar96._8_4_ * auVar124._8_4_;
          auVar184._12_4_ = auVar96._12_4_ * auVar124._12_4_;
          auVar184._16_4_ = auVar96._16_4_ * fVar164;
          auVar184._20_4_ = auVar96._20_4_ * fVar160;
          auVar184._24_4_ = auVar96._24_4_ * fVar159;
          auVar184._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar184,auVar102,auVar97);
          auVar103 = vfmadd231ps_avx512vl(auVar100,auVar93,ZEXT1632(auVar91));
          auVar100 = vmulps_avx512vl(auVar101,auVar125);
          auVar100 = vfmsub231ps_avx512vl(auVar100,auVar98,auVar127);
          auVar56._4_4_ = auVar99._4_4_ * auVar127._4_4_;
          auVar56._0_4_ = auVar99._0_4_ * auVar127._0_4_;
          auVar56._8_4_ = auVar99._8_4_ * auVar127._8_4_;
          auVar56._12_4_ = auVar99._12_4_ * auVar127._12_4_;
          auVar56._16_4_ = auVar99._16_4_ * fVar82;
          auVar56._20_4_ = auVar99._20_4_ * fVar81;
          auVar56._24_4_ = auVar99._24_4_ * fVar133;
          auVar56._28_4_ = iVar2;
          auVar91 = vfmsub231ps_fma(auVar56,auVar126,auVar101);
          auVar185._0_4_ = auVar126._0_4_ * auVar98._0_4_;
          auVar185._4_4_ = auVar126._4_4_ * auVar98._4_4_;
          auVar185._8_4_ = auVar126._8_4_ * auVar98._8_4_;
          auVar185._12_4_ = auVar126._12_4_ * auVar98._12_4_;
          auVar185._16_4_ = fVar180 * auVar98._16_4_;
          auVar185._20_4_ = fVar172 * auVar98._20_4_;
          auVar185._24_4_ = fVar161 * auVar98._24_4_;
          auVar185._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar185,auVar99,auVar125);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar93,auVar100);
          auVar92 = vfmadd231ps_avx512vl(auVar100,auVar93,ZEXT1632(auVar91));
          auVar188 = ZEXT3264(auVar92);
          auVar100 = vmaxps_avx(auVar103,auVar92);
          uVar162 = vcmpps_avx512vl(auVar100,auVar93,2);
          bVar79 = bVar79 & (byte)uVar162;
          if (bVar79 != 0) {
            auVar57._4_4_ = auVar101._4_4_ * auVar96._4_4_;
            auVar57._0_4_ = auVar101._0_4_ * auVar96._0_4_;
            auVar57._8_4_ = auVar101._8_4_ * auVar96._8_4_;
            auVar57._12_4_ = auVar101._12_4_ * auVar96._12_4_;
            auVar57._16_4_ = auVar101._16_4_ * auVar96._16_4_;
            auVar57._20_4_ = auVar101._20_4_ * auVar96._20_4_;
            auVar57._24_4_ = auVar101._24_4_ * auVar96._24_4_;
            auVar57._28_4_ = auVar100._28_4_;
            auVar85 = vfmsub231ps_fma(auVar57,auVar99,auVar97);
            auVar58._4_4_ = auVar97._4_4_ * auVar98._4_4_;
            auVar58._0_4_ = auVar97._0_4_ * auVar98._0_4_;
            auVar58._8_4_ = auVar97._8_4_ * auVar98._8_4_;
            auVar58._12_4_ = auVar97._12_4_ * auVar98._12_4_;
            auVar58._16_4_ = auVar97._16_4_ * auVar98._16_4_;
            auVar58._20_4_ = auVar97._20_4_ * auVar98._20_4_;
            auVar58._24_4_ = auVar97._24_4_ * auVar98._24_4_;
            auVar58._28_4_ = auVar97._28_4_;
            auVar87 = vfmsub231ps_fma(auVar58,auVar107,auVar101);
            auVar59._4_4_ = auVar99._4_4_ * auVar107._4_4_;
            auVar59._0_4_ = auVar99._0_4_ * auVar107._0_4_;
            auVar59._8_4_ = auVar99._8_4_ * auVar107._8_4_;
            auVar59._12_4_ = auVar99._12_4_ * auVar107._12_4_;
            auVar59._16_4_ = auVar99._16_4_ * auVar107._16_4_;
            auVar59._20_4_ = auVar99._20_4_ * auVar107._20_4_;
            auVar59._24_4_ = auVar99._24_4_ * auVar107._24_4_;
            auVar59._28_4_ = auVar99._28_4_;
            auVar84 = vfmsub231ps_fma(auVar59,auVar98,auVar96);
            auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar84));
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT1632(auVar85),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar100 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
            auVar200 = ZEXT3264(auVar100);
            auVar97 = auVar214._0_32_;
            auVar96 = vfnmadd213ps_avx512vl(auVar100,ZEXT1632(auVar86),auVar97);
            auVar91 = vfmadd132ps_fma(auVar96,auVar100,auVar100);
            auVar197 = ZEXT1664(auVar91);
            auVar60._4_4_ = auVar84._4_4_ * auVar124._4_4_;
            auVar60._0_4_ = auVar84._0_4_ * auVar124._0_4_;
            auVar60._8_4_ = auVar84._8_4_ * auVar124._8_4_;
            auVar60._12_4_ = auVar84._12_4_ * auVar124._12_4_;
            auVar60._16_4_ = fVar164 * 0.0;
            auVar60._20_4_ = fVar160 * 0.0;
            auVar60._24_4_ = fVar159 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar87 = vfmadd231ps_fma(auVar60,auVar102,ZEXT1632(auVar87));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar106,ZEXT1632(auVar85));
            fVar164 = auVar91._0_4_;
            fVar159 = auVar91._4_4_;
            fVar160 = auVar91._8_4_;
            fVar161 = auVar91._12_4_;
            local_3c0 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar161,
                                           CONCAT48(auVar87._8_4_ * fVar160,
                                                    CONCAT44(auVar87._4_4_ * fVar159,
                                                             auVar87._0_4_ * fVar164))));
            auVar213 = ZEXT3264(local_3c0);
            uVar162 = vcmpps_avx512vl(local_3c0,local_560,0xd);
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar25._4_4_ = uVar143;
            auVar25._0_4_ = uVar143;
            auVar25._8_4_ = uVar143;
            auVar25._12_4_ = uVar143;
            auVar25._16_4_ = uVar143;
            auVar25._20_4_ = uVar143;
            auVar25._24_4_ = uVar143;
            auVar25._28_4_ = uVar143;
            uVar20 = vcmpps_avx512vl(local_3c0,auVar25,2);
            bVar79 = (byte)uVar162 & (byte)uVar20 & bVar79;
            if (bVar79 != 0) {
              uVar80 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar80 = bVar79 & uVar80;
              if ((char)uVar80 != '\0') {
                fVar172 = auVar103._0_4_ * fVar164;
                fVar180 = auVar103._4_4_ * fVar159;
                auVar61._4_4_ = fVar180;
                auVar61._0_4_ = fVar172;
                fVar81 = auVar103._8_4_ * fVar160;
                auVar61._8_4_ = fVar81;
                fVar82 = auVar103._12_4_ * fVar161;
                auVar61._12_4_ = fVar82;
                fVar133 = auVar103._16_4_ * 0.0;
                auVar61._16_4_ = fVar133;
                fVar134 = auVar103._20_4_ * 0.0;
                auVar61._20_4_ = fVar134;
                fVar135 = auVar103._24_4_ * 0.0;
                auVar61._24_4_ = fVar135;
                auVar61._28_4_ = auVar103._28_4_;
                auVar100 = vsubps_avx512vl(auVar97,auVar61);
                local_400._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar172 |
                            (uint)!(bool)(bVar68 & 1) * auVar100._0_4_);
                bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar12 * (int)fVar180 | (uint)!bVar12 * auVar100._4_4_);
                bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar12 * (int)fVar81 | (uint)!bVar12 * auVar100._8_4_);
                bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar12 * (int)fVar82 | (uint)!bVar12 * auVar100._12_4_);
                bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar12 * (int)fVar133 | (uint)!bVar12 * auVar100._16_4_);
                bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar100._20_4_);
                bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar100._24_4_);
                bVar12 = SUB81(uVar70 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar100._28_4_);
                auVar100 = vsubps_avx(auVar95,auVar94);
                auVar91 = vfmadd213ps_fma(auVar100,local_400,auVar94);
                uVar143 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar26._4_4_ = uVar143;
                auVar26._0_4_ = uVar143;
                auVar26._8_4_ = uVar143;
                auVar26._12_4_ = uVar143;
                auVar26._16_4_ = uVar143;
                auVar26._20_4_ = uVar143;
                auVar26._24_4_ = uVar143;
                auVar26._28_4_ = uVar143;
                auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                              CONCAT48(auVar91._8_4_ + auVar91._8_4_
                                                                       ,CONCAT44(auVar91._4_4_ +
                                                                                 auVar91._4_4_,
                                                                                 auVar91._0_4_ +
                                                                                 auVar91._0_4_)))),
                                           auVar26);
                uVar73 = vcmpps_avx512vl(local_3c0,auVar100,6);
                uVar80 = uVar80 & uVar73;
                bVar79 = (byte)uVar80;
                if (bVar79 != 0) {
                  auVar163._0_4_ = auVar92._0_4_ * fVar164;
                  auVar163._4_4_ = auVar92._4_4_ * fVar159;
                  auVar163._8_4_ = auVar92._8_4_ * fVar160;
                  auVar163._12_4_ = auVar92._12_4_ * fVar161;
                  auVar163._16_4_ = auVar92._16_4_ * 0.0;
                  auVar163._20_4_ = auVar92._20_4_ * 0.0;
                  auVar163._24_4_ = auVar92._24_4_ * 0.0;
                  auVar163._28_4_ = 0;
                  auVar100 = vsubps_avx512vl(auVar97,auVar163);
                  auVar129._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar163._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar100._0_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar12 * (int)auVar163._4_4_ | (uint)!bVar12 * auVar100._4_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar12 * (int)auVar163._8_4_ | (uint)!bVar12 * auVar100._8_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar12 * (int)auVar163._12_4_ | (uint)!bVar12 * auVar100._12_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar12 * (int)auVar163._16_4_ | (uint)!bVar12 * auVar100._16_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar12 * (int)auVar163._20_4_ | (uint)!bVar12 * auVar100._20_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar12 * (int)auVar163._24_4_ | (uint)!bVar12 * auVar100._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar100._28_4_;
                  auVar27._8_4_ = 0x40000000;
                  auVar27._0_8_ = 0x4000000040000000;
                  auVar27._12_4_ = 0x40000000;
                  auVar27._16_4_ = 0x40000000;
                  auVar27._20_4_ = 0x40000000;
                  auVar27._24_4_ = 0x40000000;
                  auVar27._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar129,auVar97,auVar27);
                  local_3a0 = (undefined4)lVar77;
                  auVar200 = ZEXT1664(auVar83);
                  local_380 = local_680;
                  uStack_378 = uStack_678;
                  local_370 = local_690;
                  uStack_368 = uStack_688;
                  local_360 = local_6a0;
                  uStack_358 = uStack_698;
                  pGVar75 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar91 = vcvtsi2ss_avx512f(auVar90,local_3a0);
                    fVar164 = auVar91._0_4_;
                    local_340[0] = (fVar164 + local_400._0_4_ + 0.0) * local_100;
                    local_340[1] = (fVar164 + local_400._4_4_ + 1.0) * fStack_fc;
                    local_340[2] = (fVar164 + local_400._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (fVar164 + local_400._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (fVar164 + local_400._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (fVar164 + local_400._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (fVar164 + local_400._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = fVar164 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_3c0;
                    auVar151._8_4_ = 0x7f800000;
                    auVar151._0_8_ = 0x7f8000007f800000;
                    auVar151._12_4_ = 0x7f800000;
                    auVar151._16_4_ = 0x7f800000;
                    auVar151._20_4_ = 0x7f800000;
                    auVar151._24_4_ = 0x7f800000;
                    auVar151._28_4_ = 0x7f800000;
                    auVar100 = vblendmps_avx512vl(auVar151,local_3c0);
                    auVar130._0_4_ =
                         (uint)(bVar79 & 1) * auVar100._0_4_ |
                         (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar130._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar130._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
                    auVar130._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
                    auVar130._16_4_ = (uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
                    auVar130._20_4_ = (uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
                    auVar130._24_4_ = (uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar80 >> 7,0);
                    auVar130._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar100 = vshufps_avx(auVar130,auVar130,0xb1);
                    auVar100 = vminps_avx(auVar130,auVar100);
                    auVar96 = vshufpd_avx(auVar100,auVar100,5);
                    auVar100 = vminps_avx(auVar100,auVar96);
                    auVar96 = vpermpd_avx2(auVar100,0x4e);
                    auVar100 = vminps_avx(auVar100,auVar96);
                    uVar162 = vcmpps_avx512vl(auVar130,auVar100,0);
                    uVar71 = (uint)uVar80;
                    if ((bVar79 & (byte)uVar162) != 0) {
                      uVar71 = (uint)(bVar79 & (byte)uVar162);
                    }
                    uVar72 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar70 = (ulong)uVar72;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_640 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_618 = pGVar75;
                      local_5a8 = lVar74;
                      local_580 = local_3c0;
                      local_39c = iVar9;
                      local_390 = auVar83;
                      do {
                        local_1c0 = local_340[uVar70];
                        local_1a0 = *(undefined4 *)(local_320 + uVar70 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar70 * 4);
                        local_670.context = context->user;
                        fVar159 = 1.0 - local_1c0;
                        fVar164 = fVar159 * fVar159 * -3.0;
                        auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                                  ZEXT416((uint)(local_1c0 * fVar159)),
                                                  ZEXT416(0xc0000000));
                        auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar159)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar159 = auVar91._0_4_ * 3.0;
                        fVar160 = auVar86._0_4_ * 3.0;
                        fVar161 = local_1c0 * local_1c0 * 3.0;
                        auVar191._0_4_ = fVar161 * fVar142;
                        auVar191._4_4_ = fVar161 * fVar156;
                        auVar191._8_4_ = fVar161 * fVar157;
                        auVar191._12_4_ = fVar161 * fVar158;
                        auVar144._4_4_ = fVar160;
                        auVar144._0_4_ = fVar160;
                        auVar144._8_4_ = fVar160;
                        auVar144._12_4_ = fVar160;
                        auVar91 = vfmadd132ps_fma(auVar144,auVar191,auVar6);
                        auVar177._4_4_ = fVar159;
                        auVar177._0_4_ = fVar159;
                        auVar177._8_4_ = fVar159;
                        auVar177._12_4_ = fVar159;
                        auVar91 = vfmadd132ps_fma(auVar177,auVar91,auVar19);
                        auVar145._4_4_ = fVar164;
                        auVar145._0_4_ = fVar164;
                        auVar145._8_4_ = fVar164;
                        auVar145._12_4_ = fVar164;
                        auVar91 = vfmadd213ps_fma(auVar145,auVar83,auVar91);
                        local_220 = auVar91._0_4_;
                        auVar186._8_4_ = 1;
                        auVar186._0_8_ = 0x100000001;
                        auVar186._12_4_ = 1;
                        auVar186._16_4_ = 1;
                        auVar186._20_4_ = 1;
                        auVar186._24_4_ = 1;
                        auVar186._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar186,ZEXT1632(auVar91));
                        auVar188 = ZEXT3264(local_200);
                        auVar192._8_4_ = 2;
                        auVar192._0_8_ = 0x200000002;
                        auVar192._12_4_ = 2;
                        auVar195._16_4_ = 2;
                        auVar195._0_16_ = auVar192;
                        auVar195._20_4_ = 2;
                        auVar195._24_4_ = 2;
                        auVar195._28_4_ = 2;
                        auVar197 = ZEXT3264(auVar195);
                        local_1e0 = vpermps_avx2(auVar195,ZEXT1632(auVar91));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_2c0._0_8_;
                        uStack_178 = local_2c0._8_8_;
                        uStack_170 = local_2c0._16_8_;
                        uStack_168 = local_2c0._24_8_;
                        local_160 = local_2a0;
                        auVar100 = vpcmpeqd_avx2(local_2a0,local_2a0);
                        local_608[1] = auVar100;
                        *local_608 = auVar100;
                        local_140 = (local_670.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_670.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_5e0 = local_2e0;
                        local_670.valid = (int *)local_5e0;
                        local_670.geometryUserPtr = pGVar75->userPtr;
                        local_670.hit = (RTCHitN *)&local_220;
                        local_670.N = 8;
                        local_630._0_8_ = uVar70;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar188 = ZEXT1664(local_200._0_16_);
                          auVar197 = ZEXT1664(auVar192);
                          (*pGVar75->intersectionFilterN)(&local_670);
                          auVar213 = ZEXT3264(local_580);
                          pGVar75 = local_618;
                          uVar70 = local_630._0_8_;
                        }
                        uVar71 = (uint)uVar70;
                        if (local_5e0 == (undefined1  [32])0x0) {
LAB_019b8110:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar188 = ZEXT1664(auVar188._0_16_);
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            (*p_Var11)(&local_670);
                            auVar213 = ZEXT3264(local_580);
                            pGVar75 = local_618;
                            uVar71 = local_630._0_4_;
                          }
                          if (local_5e0 == (undefined1  [32])0x0) goto LAB_019b8110;
                          uVar70 = vptestmd_avx512vl(local_5e0,local_5e0);
                          iVar1 = *(int *)(local_670.hit + 4);
                          iVar2 = *(int *)(local_670.hit + 8);
                          iVar62 = *(int *)(local_670.hit + 0xc);
                          iVar63 = *(int *)(local_670.hit + 0x10);
                          iVar64 = *(int *)(local_670.hit + 0x14);
                          iVar65 = *(int *)(local_670.hit + 0x18);
                          iVar66 = *(int *)(local_670.hit + 0x1c);
                          bVar79 = (byte)uVar70;
                          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar18 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_670.ray + 0x180) =
                               (uint)(bVar79 & 1) * *(int *)local_670.hit |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x180);
                          *(uint *)(local_670.ray + 0x184) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x184);
                          *(uint *)(local_670.ray + 0x188) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x188);
                          *(uint *)(local_670.ray + 0x18c) =
                               (uint)bVar14 * iVar62 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x18c);
                          *(uint *)(local_670.ray + 400) =
                               (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_670.ray + 400)
                          ;
                          *(uint *)(local_670.ray + 0x194) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x194);
                          *(uint *)(local_670.ray + 0x198) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x198);
                          *(uint *)(local_670.ray + 0x19c) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x19c);
                          iVar1 = *(int *)(local_670.hit + 0x24);
                          iVar2 = *(int *)(local_670.hit + 0x28);
                          iVar62 = *(int *)(local_670.hit + 0x2c);
                          iVar63 = *(int *)(local_670.hit + 0x30);
                          iVar64 = *(int *)(local_670.hit + 0x34);
                          iVar65 = *(int *)(local_670.hit + 0x38);
                          iVar66 = *(int *)(local_670.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar18 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_670.ray + 0x1a0) =
                               (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x20) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x1a0);
                          *(uint *)(local_670.ray + 0x1a4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1a4);
                          *(uint *)(local_670.ray + 0x1a8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1a8);
                          *(uint *)(local_670.ray + 0x1ac) =
                               (uint)bVar14 * iVar62 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1ac);
                          *(uint *)(local_670.ray + 0x1b0) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1b0);
                          *(uint *)(local_670.ray + 0x1b4) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1b4);
                          *(uint *)(local_670.ray + 0x1b8) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1b8);
                          *(uint *)(local_670.ray + 0x1bc) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1bc);
                          iVar1 = *(int *)(local_670.hit + 0x44);
                          iVar2 = *(int *)(local_670.hit + 0x48);
                          iVar62 = *(int *)(local_670.hit + 0x4c);
                          iVar63 = *(int *)(local_670.hit + 0x50);
                          iVar64 = *(int *)(local_670.hit + 0x54);
                          iVar65 = *(int *)(local_670.hit + 0x58);
                          iVar66 = *(int *)(local_670.hit + 0x5c);
                          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar18 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_670.ray + 0x1c0) =
                               (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x40) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x1c0);
                          *(uint *)(local_670.ray + 0x1c4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1c4);
                          *(uint *)(local_670.ray + 0x1c8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1c8);
                          *(uint *)(local_670.ray + 0x1cc) =
                               (uint)bVar14 * iVar62 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1cc);
                          *(uint *)(local_670.ray + 0x1d0) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1d0);
                          *(uint *)(local_670.ray + 0x1d4) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1d4);
                          *(uint *)(local_670.ray + 0x1d8) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1d8);
                          *(uint *)(local_670.ray + 0x1dc) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1dc);
                          iVar1 = *(int *)(local_670.hit + 100);
                          iVar2 = *(int *)(local_670.hit + 0x68);
                          iVar62 = *(int *)(local_670.hit + 0x6c);
                          iVar63 = *(int *)(local_670.hit + 0x70);
                          iVar64 = *(int *)(local_670.hit + 0x74);
                          iVar65 = *(int *)(local_670.hit + 0x78);
                          iVar66 = *(int *)(local_670.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar18 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_670.ray + 0x1e0) =
                               (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x60) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x1e0);
                          *(uint *)(local_670.ray + 0x1e4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1e4);
                          *(uint *)(local_670.ray + 0x1e8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1e8);
                          *(uint *)(local_670.ray + 0x1ec) =
                               (uint)bVar14 * iVar62 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1ec);
                          *(uint *)(local_670.ray + 0x1f0) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1f0);
                          *(uint *)(local_670.ray + 500) =
                               (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_670.ray + 500)
                          ;
                          *(uint *)(local_670.ray + 0x1f8) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1f8);
                          *(uint *)(local_670.ray + 0x1fc) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1fc);
                          iVar1 = *(int *)(local_670.hit + 0x84);
                          iVar2 = *(int *)(local_670.hit + 0x88);
                          iVar62 = *(int *)(local_670.hit + 0x8c);
                          iVar63 = *(int *)(local_670.hit + 0x90);
                          iVar64 = *(int *)(local_670.hit + 0x94);
                          iVar65 = *(int *)(local_670.hit + 0x98);
                          iVar66 = *(int *)(local_670.hit + 0x9c);
                          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar18 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_670.ray + 0x200) =
                               (uint)(bVar79 & 1) * *(int *)(local_670.hit + 0x80) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_670.ray + 0x200);
                          *(uint *)(local_670.ray + 0x204) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x204);
                          *(uint *)(local_670.ray + 0x208) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x208);
                          *(uint *)(local_670.ray + 0x20c) =
                               (uint)bVar14 * iVar62 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x20c);
                          *(uint *)(local_670.ray + 0x210) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x210);
                          *(uint *)(local_670.ray + 0x214) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x214);
                          *(uint *)(local_670.ray + 0x218) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x218);
                          *(uint *)(local_670.ray + 0x21c) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x21c);
                          auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar100;
                          auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar100;
                          auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar100;
                          auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_670.hit + 0x100));
                          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar100;
                          local_640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_640._4_4_ = 0;
                          local_640._8_4_ = 0;
                          local_640._12_4_ = 0;
                        }
                        auVar200 = ZEXT1664(auVar83);
                        bVar79 = ~(byte)(1 << (uVar71 & 0x1f)) & (byte)uVar80;
                        auVar152._4_4_ = local_640._0_4_;
                        auVar152._0_4_ = local_640._0_4_;
                        auVar152._8_4_ = local_640._0_4_;
                        auVar152._12_4_ = local_640._0_4_;
                        auVar152._16_4_ = local_640._0_4_;
                        auVar152._20_4_ = local_640._0_4_;
                        auVar152._24_4_ = local_640._0_4_;
                        auVar152._28_4_ = local_640._0_4_;
                        uVar162 = vcmpps_avx512vl(auVar213._0_32_,auVar152,2);
                        if ((bVar79 & (byte)uVar162) == 0) goto LAB_019b81ad;
                        bVar79 = bVar79 & (byte)uVar162;
                        uVar80 = (ulong)bVar79;
                        auVar153._8_4_ = 0x7f800000;
                        auVar153._0_8_ = 0x7f8000007f800000;
                        auVar153._12_4_ = 0x7f800000;
                        auVar153._16_4_ = 0x7f800000;
                        auVar153._20_4_ = 0x7f800000;
                        auVar153._24_4_ = 0x7f800000;
                        auVar153._28_4_ = 0x7f800000;
                        auVar100 = vblendmps_avx512vl(auVar153,auVar213._0_32_);
                        auVar131._0_4_ =
                             (uint)(bVar79 & 1) * auVar100._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 1 & 1);
                        auVar131._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 2 & 1);
                        auVar131._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 3 & 1);
                        auVar131._12_4_ =
                             (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 4 & 1);
                        auVar131._16_4_ =
                             (uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 5 & 1);
                        auVar131._20_4_ =
                             (uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 6 & 1);
                        auVar131._24_4_ =
                             (uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar131._28_4_ =
                             (uint)(bVar79 >> 7) * auVar100._28_4_ |
                             (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                        auVar100 = vshufps_avx(auVar131,auVar131,0xb1);
                        auVar100 = vminps_avx(auVar131,auVar100);
                        auVar96 = vshufpd_avx(auVar100,auVar100,5);
                        auVar100 = vminps_avx(auVar100,auVar96);
                        auVar96 = vpermpd_avx2(auVar100,0x4e);
                        auVar100 = vminps_avx(auVar100,auVar96);
                        uVar162 = vcmpps_avx512vl(auVar131,auVar100,0);
                        bVar68 = (byte)uVar162 & bVar79;
                        if (bVar68 != 0) {
                          bVar79 = bVar68;
                        }
                        uVar71 = 0;
                        for (uVar72 = (uint)bVar79; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar70 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar164 = local_340[uVar70];
                    uVar143 = *(undefined4 *)(local_320 + uVar70 * 4);
                    fVar160 = 1.0 - fVar164;
                    fVar159 = fVar160 * fVar160 * -3.0;
                    auVar188 = ZEXT464((uint)fVar159);
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),
                                              ZEXT416((uint)(fVar164 * fVar160)),ZEXT416(0xc0000000)
                                             );
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar164 * fVar160)),
                                              ZEXT416((uint)(fVar164 * fVar164)),ZEXT416(0x40000000)
                                             );
                    fVar160 = auVar91._0_4_ * 3.0;
                    fVar161 = auVar86._0_4_ * 3.0;
                    fVar172 = fVar164 * fVar164 * 3.0;
                    auVar190._0_4_ = fVar172 * fVar142;
                    auVar190._4_4_ = fVar172 * fVar156;
                    auVar190._8_4_ = fVar172 * fVar157;
                    auVar190._12_4_ = fVar172 * fVar158;
                    auVar197 = ZEXT1664(auVar190);
                    auVar169._4_4_ = fVar161;
                    auVar169._0_4_ = fVar161;
                    auVar169._8_4_ = fVar161;
                    auVar169._12_4_ = fVar161;
                    auVar91 = vfmadd132ps_fma(auVar169,auVar190,auVar6);
                    auVar176._4_4_ = fVar160;
                    auVar176._0_4_ = fVar160;
                    auVar176._8_4_ = fVar160;
                    auVar176._12_4_ = fVar160;
                    auVar91 = vfmadd132ps_fma(auVar176,auVar91,auVar19);
                    auVar170._4_4_ = fVar159;
                    auVar170._0_4_ = fVar159;
                    auVar170._8_4_ = fVar159;
                    auVar170._12_4_ = fVar159;
                    auVar91 = vfmadd213ps_fma(auVar170,auVar83,auVar91);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar91._0_4_;
                    uVar10 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar164;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar143;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                    *(uint *)(ray + k * 4 + 0x240) = uVar8;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019b7ded;
      }
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar24._4_4_ = uVar3;
    auVar24._0_4_ = uVar3;
    auVar24._8_4_ = uVar3;
    auVar24._12_4_ = uVar3;
    auVar24._16_4_ = uVar3;
    auVar24._20_4_ = uVar3;
    auVar24._24_4_ = uVar3;
    auVar24._28_4_ = uVar3;
    uVar162 = vcmpps_avx512vl(auVar215._0_32_,auVar24,2);
    uVar76 = (ulong)((uint)uVar76 & (uint)uVar162);
  } while( true );
LAB_019b81ad:
  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar214 = ZEXT3264(auVar100);
  auVar215 = ZEXT3264(local_520);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar216 = ZEXT1664(auVar91);
  lVar74 = local_5a8;
LAB_019b7ded:
  lVar77 = lVar77 + 8;
  goto LAB_019b7511;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }